

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void compute_stats_win7_avx2
               (int16_t *d,int32_t d_stride,int16_t *s,int32_t s_stride,int32_t width,int v_start,
               int v_end,int64_t *M,int64_t *H,int use_downsampled_wiener_stats)

{
  undefined1 auVar1 [32];
  __m256i dgd_28;
  __m256i dgd_29;
  __m256i dgd_30;
  __m256i dgd_31;
  __m256i dgd_32;
  __m256i dgd_33;
  __m256i dgd_34;
  __m256i dgd_35;
  __m256i dgd_36;
  __m256i dgd_37;
  __m256i dgd_38;
  __m256i dgd_39;
  __m256i dgd_40;
  __m256i dgd_41;
  __m256i dgd_42;
  __m256i dgd_43;
  __m256i dgd_44;
  __m256i dgd_45;
  __m256i dgd_46;
  __m256i dgd_47;
  __m256i dgd_48;
  __m256i dgd_49;
  __m256i dgd_50;
  __m256i dgd_51;
  __m256i dgd_52;
  __m256i dgd_53;
  __m256i dgd_54;
  __m256i dgd_55;
  __m256i dgd_56;
  __m256i dgd_57;
  __m256i src_00;
  __m256i src_01;
  __m256i src_02;
  __m256i src_03;
  __m256i src_04;
  __m256i src_05;
  __m256i src1;
  __m256i src_06;
  __m256i src_07;
  __m256i src_08;
  __m256i src_09;
  __m256i src_10;
  __m256i src_11;
  __m256i src_12;
  __m256i src_13;
  __m256i src_14;
  __m256i src_15;
  __m256i src_16;
  __m256i src_17;
  __m256i src_18;
  __m256i src_19;
  __m256i src_20;
  __m256i src_21;
  __m256i src_22;
  __m256i src_23;
  __m256i src_24;
  __m256i src_25;
  __m256i src_26;
  __m256i src_27;
  __m256i src_28;
  __m256i src_29;
  __m256i src_30;
  __m256i src0;
  __m256i src1_00;
  __m256i src1_01;
  __m256i src1_02;
  __m256i src1_03;
  __m256i src1_04;
  __m256i src1_05;
  __m256i src1_06;
  __m256i src1_07;
  __m256i src1_08;
  __m256i src1_09;
  __m256i src1_10;
  __m256i src1_11;
  __m256i src1_12;
  __m256i src1_13;
  __m256i src1_14;
  __m256i src1_15;
  __m256i src1_16;
  __m256i src1_17;
  __m256i src1_18;
  __m256i src1_19;
  __m256i src1_20;
  __m256i src1_21;
  __m256i src1_22;
  __m256i src1_23;
  __m256i src1_24;
  __m256i src0_00;
  __m256i src0_01;
  __m256i src0_02;
  __m256i src0_03;
  __m256i src0_04;
  __m256i src0_05;
  __m256i src0_06;
  __m256i src0_07;
  __m256i src0_08;
  __m256i src0_09;
  __m256i src0_10;
  __m256i src0_11;
  __m256i src0_12;
  __m256i src0_13;
  __m256i src0_14;
  __m256i src0_15;
  __m256i src0_16;
  __m256i src0_17;
  __m256i src0_18;
  __m256i src0_19;
  __m256i src0_20;
  __m256i src0_21;
  __m256i src0_22;
  __m256i src0_23;
  __m256i src0_24;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  int in_ECX;
  long lVar46;
  long lVar47;
  long in_RDX;
  longlong extraout_RDX;
  int in_ESI;
  undefined8 *puVar48;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined8 uVar49;
  undefined8 uVar50;
  int64_t iVar51;
  int64_t iVar52;
  undefined8 uVar56;
  undefined8 uVar57;
  int64_t iVar58;
  int64_t iVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  int64_t iVar62;
  int64_t iVar63;
  undefined8 uVar64;
  int64_t iVar65;
  int64_t iVar66;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  __m128i v;
  int in_stack_00000008;
  undefined4 in_stack_00000014;
  __m256i sh_1_1;
  __m256i sh_0_1;
  __m256i dgd0_25;
  int g_27;
  __m256i dgd_mul_df_27;
  __m256i dgd_mask_13;
  __m256i dgd_27;
  __m256i dgd0_24;
  int g_26;
  __m256i dgd_mul_df_26;
  __m256i dgd_26;
  __m256i df_reg_13;
  int proc_wd_13;
  __m256i sum_h_7 [7];
  int16_t *d_current_row_6;
  int16_t *d_window_6;
  int proc_ht_7;
  int shift;
  int i_6;
  __m256i s_h2_5;
  __m256i s_h1_5;
  __m256i dgd0_23;
  int g_25;
  __m256i dgd_mul_df_25;
  __m256i dgd_mask_12;
  __m256i dgd_25;
  __m256i dgd0_22;
  int g_24;
  __m256i dgd_mul_df_24;
  __m256i dgd_24;
  __m256i df_reg_12;
  int proc_wd_12;
  __m256i zero_5;
  __m256i s_h_5;
  __m256i dgd0_21;
  int g_23;
  __m256i dgd_mul_df_23;
  __m256i dgd_mask_11;
  __m256i dgd_23;
  __m256i dgd0_20;
  int g_22;
  __m256i dgd_mul_df_22;
  __m256i dgd_22;
  __m256i df_reg_11;
  int proc_wd_11;
  __m256i sum_h_6 [7];
  int proc_ht_6;
  int16_t *d_current_row_5;
  int16_t *d_window_5;
  int i_5;
  __m256i s_h2_4;
  __m256i s_h1_4;
  __m256i dgd0_19;
  int g_21;
  __m256i dgd_mul_df_21;
  __m256i dgd_mask_10;
  __m256i dgd_21;
  __m256i dgd0_18;
  int g_20;
  __m256i dgd_mul_df_20;
  __m256i dgd_20;
  __m256i df_reg_10;
  int proc_wd_10;
  __m256i zero_4;
  __m256i s_h_4;
  __m256i dgd0_17;
  int g_19;
  __m256i dgd_mul_df_19;
  __m256i dgd_mask_9;
  __m256i dgd_19;
  __m256i dgd0_16;
  int g_18;
  __m256i dgd_mul_df_18;
  __m256i dgd_18;
  __m256i df_reg_9;
  int proc_wd_9;
  __m256i sum_h_5 [7];
  int proc_ht_5;
  int16_t *d_current_row_4;
  int16_t *d_window_4;
  int i_4;
  __m256i s_h2_3;
  __m256i s_h1_3;
  __m256i dgd0_15;
  int g_17;
  __m256i dgd_mul_df_17;
  __m256i dgd_mask_8;
  __m256i dgd_17;
  __m256i dgd0_14;
  int g_16;
  __m256i dgd_mul_df_16;
  __m256i dgd_16;
  __m256i df_reg_8;
  int proc_wd_8;
  __m256i zero_3;
  __m256i s_h_3;
  __m256i dgd0_13;
  int g_15;
  __m256i dgd_mul_df_15;
  __m256i dgd_mask_7;
  __m256i dgd_15;
  __m256i dgd0_12;
  int g_14;
  __m256i dgd_mul_df_14;
  __m256i dgd_14;
  __m256i df_reg_7;
  int proc_wd_7;
  __m256i sum_h_4 [7];
  int proc_ht_4;
  int16_t *d_current_row_3;
  int16_t *d_window_3;
  int i_3;
  __m256i s_h2_2;
  __m256i s_h1_2;
  __m256i dgd0_11;
  int g_13;
  __m256i dgd_mul_df_13;
  __m256i dgd_mask_6;
  __m256i dgd_13;
  __m256i dgd0_10;
  int g_12;
  __m256i dgd_mul_df_12;
  __m256i dgd_12;
  __m256i df_reg_6;
  int proc_wd_6;
  __m256i zero_2;
  __m256i s_h_2;
  __m256i dgd0_9;
  int g_11;
  __m256i dgd_mul_df_11;
  __m256i dgd_mask_5;
  __m256i dgd_11;
  __m256i dgd0_8;
  int g_10;
  __m256i dgd_mul_df_10;
  __m256i dgd_10;
  __m256i df_reg_5;
  int proc_wd_5;
  __m256i sum_h_3 [7];
  int proc_ht_3;
  int16_t *d_current_row_2;
  int16_t *d_window_2;
  int i_2;
  __m256i s_h2_1;
  __m256i s_h1_1;
  __m256i dgd0_7;
  int g_9;
  __m256i dgd_mul_df_9;
  __m256i dgd_mask_4;
  __m256i dgd_9;
  __m256i dgd0_6;
  int g_8;
  __m256i dgd_mul_df_8;
  __m256i dgd_8;
  __m256i df_reg_4;
  int proc_wd_4;
  __m256i zero_1;
  __m128i s_m_h0;
  __m256i s_m_h;
  __m256i s_h_1;
  __m256i dgd0_5;
  int g_7;
  __m256i dgd_mul_df_7;
  __m256i dgd_mask_3;
  __m256i dgd_7;
  __m256i dgd0_4;
  int g_6;
  __m256i dgd_mul_df_6;
  __m256i dgd_6;
  __m256i df_reg_3;
  int proc_wd_3;
  __m256i sum_h_2 [7];
  int proc_ht_2;
  int16_t *d_current_row_1;
  int16_t *d_window_1;
  int i_1;
  __m256i s_h2;
  __m256i s_h1;
  __m256i dgd0_3;
  int g_5;
  __m256i dgd_mul_df_5;
  __m256i dgd_mask_2;
  __m256i dgd_5;
  __m256i dgd0_2;
  int g_4;
  __m256i dgd_mul_df_4;
  __m256i dgd_4;
  __m256i df_reg_2;
  int proc_wd_2;
  __m256i zero;
  __m128i s_h0;
  __m256i s_h;
  __m256i dgd0_1;
  int g_3;
  __m256i dgd_mul_df_3;
  __m256i dgd_mask_1;
  __m256i dgd_3;
  __m256i dgd0;
  int g_2;
  __m256i dgd_mul_df_2;
  __m256i dgd_2;
  __m256i df_reg_1;
  int proc_wd_1;
  __m256i sum_h_1 [7];
  int proc_ht_1;
  int16_t *d_current_row;
  int16_t *d_window;
  int i;
  __m256i sh_1;
  __m256i sh_0;
  __m256i s_m1;
  __m256i s_m0;
  __m256i dgds_0_1;
  int g_1;
  __m256i dgd_mul_df_1;
  __m256i src_mul_df_1;
  __m256i dgd_mask;
  __m256i src_mask;
  __m256i dgd_1;
  __m256i src_1;
  __m256i dgds_0;
  int g;
  __m256i dgd_mul_df;
  __m256i src_mul_df;
  __m256i dgd;
  __m256i src;
  __m256i df_reg;
  int proc_wd;
  int proc_ht;
  __m256i sum_h [7];
  __m256i sum_m [7];
  int16_t *d_t;
  int16_t *s_t;
  int j;
  int downsample_factor;
  __m256i mask;
  int32_t wd_beyond_mul16;
  int32_t wd_mul16;
  int32_t wiener_win2;
  int32_t wiener_win;
  __m256i *in_stack_ffffffffffffc590;
  undefined2 in_stack_ffffffffffffc598;
  undefined2 in_stack_ffffffffffffc59a;
  ushort uVar67;
  ushort in_stack_ffffffffffffc59c;
  ushort in_stack_ffffffffffffc59e;
  long in_stack_ffffffffffffc5a0;
  undefined4 in_stack_ffffffffffffc5a8;
  ushort in_stack_ffffffffffffc5ac;
  ushort in_stack_ffffffffffffc5ae;
  long in_stack_ffffffffffffc5b0;
  undefined4 in_stack_ffffffffffffc5b8;
  ushort in_stack_ffffffffffffc5bc;
  ushort in_stack_ffffffffffffc5be;
  long in_stack_ffffffffffffc5c0;
  undefined4 in_stack_ffffffffffffc5c8;
  ushort in_stack_ffffffffffffc5cc;
  ushort in_stack_ffffffffffffc5ce;
  long in_stack_ffffffffffffc5d0;
  undefined4 in_stack_ffffffffffffc5d8;
  undefined2 in_stack_ffffffffffffc5dc;
  undefined2 in_stack_ffffffffffffc5de;
  undefined8 in_stack_ffffffffffffc5e0;
  undefined4 in_stack_ffffffffffffc5e8;
  ushort in_stack_ffffffffffffc5ec;
  ushort in_stack_ffffffffffffc5ee;
  __m256i *in_stack_ffffffffffffc5f0;
  undefined6 in_stack_ffffffffffffc5f8;
  ushort uVar68;
  undefined1 auVar69 [24];
  undefined8 uVar70;
  int64_t in_stack_ffffffffffffc620;
  int64_t in_stack_ffffffffffffc628;
  longlong in_stack_ffffffffffffc630;
  longlong lVar71;
  int local_3964;
  undefined1 in_stack_ffffffffffffc6a0 [32];
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  int local_38c4;
  int local_3844;
  int64_t iStack_3830;
  int64_t iStack_3828;
  int64_t local_37c0;
  int64_t iStack_37b8;
  longlong lStack_37b0;
  undefined8 *puStack_37a8;
  long local_3760;
  long local_3758;
  int local_374c;
  int local_3748;
  int local_3744;
  int local_36c4;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  int local_3624;
  int local_35a4;
  int local_3524;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  int local_3484;
  int local_3404;
  int64_t local_3400;
  int64_t iStack_33f8;
  int64_t iStack_33f0;
  int64_t iStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  int64_t local_3380;
  int64_t iStack_3378;
  int64_t iStack_3370;
  int64_t iStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  int local_331c;
  long local_3318;
  long local_3310;
  int local_3304;
  int64_t local_3300;
  int64_t iStack_32f8;
  int64_t iStack_32f0;
  int64_t iStack_32e8;
  int64_t local_32e0;
  int64_t iStack_32d8;
  int64_t iStack_32d0;
  int64_t iStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  int local_3284;
  undefined1 local_3280 [32];
  undefined1 local_3260 [32];
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  int local_31e4;
  undefined1 local_31e0 [32];
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined1 local_31a0 [16];
  undefined1 auStack_3190 [16];
  int local_3164;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  int64_t local_3140;
  int64_t iStack_3138;
  int64_t iStack_3130;
  int64_t iStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  int local_30e4;
  undefined1 local_30e0 [32];
  undefined1 local_30c0 [32];
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  int local_3044;
  undefined1 local_3040 [32];
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined1 local_3000 [16];
  undefined1 auStack_2ff0 [16];
  int local_2fc4;
  int64_t local_2fc0;
  int64_t iStack_2fb8;
  int64_t iStack_2fb0;
  int64_t iStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  int64_t local_2f40;
  int64_t iStack_2f38;
  int64_t iStack_2f30;
  int64_t iStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  int local_2edc;
  long local_2ed8;
  long local_2ed0;
  int local_2ec4;
  int64_t local_2ec0;
  int64_t iStack_2eb8;
  int64_t iStack_2eb0;
  int64_t iStack_2ea8;
  int64_t local_2ea0;
  int64_t iStack_2e98;
  int64_t iStack_2e90;
  int64_t iStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  int local_2e44;
  undefined1 local_2e40 [32];
  undefined1 local_2e20 [32];
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  int local_2da4;
  undefined1 local_2da0 [32];
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined1 local_2d60 [16];
  undefined1 auStack_2d50 [16];
  int local_2d24;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  int64_t local_2d00;
  int64_t iStack_2cf8;
  int64_t iStack_2cf0;
  int64_t iStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  int local_2ca4;
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  int local_2c04;
  undefined1 local_2c00 [32];
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined1 local_2bc0 [16];
  undefined1 auStack_2bb0 [16];
  int local_2b84;
  int64_t local_2b80;
  int64_t iStack_2b78;
  int64_t iStack_2b70;
  int64_t iStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  int64_t local_2b00;
  int64_t iStack_2af8;
  int64_t iStack_2af0;
  int64_t iStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  int local_2a9c;
  long local_2a98;
  long local_2a90;
  int local_2a84;
  int64_t local_2a80;
  int64_t iStack_2a78;
  int64_t iStack_2a70;
  int64_t iStack_2a68;
  int64_t local_2a60;
  int64_t iStack_2a58;
  int64_t iStack_2a50;
  int64_t iStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  int local_2a04;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  int local_2964;
  undefined1 local_2960 [32];
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined1 local_2920 [16];
  undefined1 auStack_2910 [16];
  int local_28e4;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  int64_t local_28c0;
  int64_t iStack_28b8;
  int64_t iStack_28b0;
  int64_t iStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  int local_2864;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  int local_27c4;
  undefined1 local_27c0 [32];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined1 local_2780 [16];
  undefined1 auStack_2770 [16];
  int local_2744;
  int64_t local_2740;
  int64_t iStack_2738;
  int64_t iStack_2730;
  int64_t iStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  int64_t local_26c0;
  int64_t iStack_26b8;
  int64_t iStack_26b0;
  int64_t iStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  int local_265c;
  long local_2658;
  long local_2650;
  int local_2644;
  int64_t local_2640;
  int64_t iStack_2638;
  int64_t iStack_2630;
  int64_t iStack_2628;
  int64_t local_2620;
  int64_t iStack_2618;
  int64_t iStack_2610;
  int64_t iStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  int local_25c4;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  int local_2524;
  undefined1 local_2520 [32];
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined1 local_24e0 [16];
  undefined1 auStack_24d0 [16];
  int local_24a4;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  int64_t local_2470;
  int64_t iStack_2468;
  int64_t local_2460;
  int64_t iStack_2458;
  int64_t iStack_2450;
  int64_t iStack_2448;
  int64_t local_2440;
  int64_t iStack_2438;
  int64_t iStack_2430;
  int64_t iStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  int local_23e4;
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  int local_2344;
  undefined1 local_2340 [32];
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_2300 [16];
  undefined1 auStack_22f0 [16];
  int local_22c4;
  int64_t local_22c0;
  int64_t iStack_22b8;
  int64_t iStack_22b0;
  int64_t iStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  int64_t local_2240;
  int64_t iStack_2238;
  int64_t iStack_2230;
  int64_t iStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  int local_21dc;
  long local_21d8;
  long local_21d0;
  int local_21c4;
  int64_t local_21c0;
  int64_t iStack_21b8;
  int64_t iStack_21b0;
  int64_t iStack_21a8;
  int64_t local_21a0;
  int64_t iStack_2198;
  int64_t iStack_2190;
  int64_t iStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  int local_2144;
  undefined1 local_2140 [32];
  undefined1 local_2120 [32];
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  int local_20a4;
  undefined1 local_20a0 [32];
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined1 local_2060 [16];
  undefined1 auStack_2050 [16];
  int local_2024;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  int64_t local_1ff0;
  int64_t iStack_1fe8;
  int64_t local_1fe0;
  int64_t iStack_1fd8;
  int64_t iStack_1fd0;
  int64_t iStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  int local_1f84;
  undefined1 local_1f80 [32];
  undefined1 local_1f60 [32];
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  int local_1ee4;
  undefined1 local_1ee0 [32];
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [16];
  undefined1 auStack_1e90 [16];
  int local_1e64;
  int64_t local_1e60;
  int64_t iStack_1e58;
  int64_t iStack_1e50;
  int64_t iStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  int64_t local_1de0;
  int64_t iStack_1dd8;
  int64_t iStack_1dd0;
  int64_t iStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  int local_1d7c;
  long local_1d78;
  long local_1d70;
  int local_1d64;
  int64_t local_1d60;
  int64_t iStack_1d58;
  undefined8 uStack_1d50;
  undefined8 *puStack_1d48;
  int64_t local_1d40;
  int64_t iStack_1d38;
  int64_t iStack_1d30;
  int64_t iStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 *puStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  int local_1ca4;
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [32];
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  int local_1ba4;
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined1 local_1b20 [16];
  undefined1 auStack_1b10 [16];
  int local_1ae8;
  int local_1ae4;
  undefined1 local_1ae0 [32];
  undefined1 local_1ac0 [32];
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [32];
  undefined1 local_19a0 [32];
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  long local_1918;
  long local_1910;
  int local_1908;
  uint local_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  int local_18d4;
  uint local_18d0;
  undefined4 local_18cc;
  undefined4 local_18c8;
  int local_18c4;
  int local_18bc;
  long local_18b8;
  int local_18ac;
  long local_18a8;
  undefined1 local_18a0 [32];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  int64_t local_1780;
  int64_t iStack_1778;
  longlong lStack_1770;
  undefined8 *puStack_1768;
  int64_t local_1760;
  int64_t iStack_1758;
  int64_t iStack_1750;
  int64_t iStack_1748;
  int64_t local_1740;
  int64_t iStack_1738;
  undefined8 uStack_1730;
  undefined8 *puStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 *puStack_1708;
  long local_16f8;
  undefined1 (*local_16f0) [32];
  long local_16e8;
  undefined1 (*local_16e0) [32];
  long local_16d8;
  undefined1 (*local_16d0) [32];
  long local_16c8;
  undefined1 (*local_16c0) [32];
  long local_16b8;
  undefined1 (*local_16b0) [32];
  long local_16a8;
  undefined1 (*local_16a0) [32];
  undefined8 *local_1698;
  undefined1 (*local_1690) [32];
  undefined8 *local_1688;
  undefined1 (*local_1680) [32];
  undefined8 *local_1678;
  undefined1 (*local_1670) [32];
  undefined8 *local_1668;
  undefined1 (*local_1660) [32];
  undefined8 *local_1658;
  undefined1 (*local_1650) [32];
  undefined8 *local_1648;
  undefined1 (*local_1640) [32];
  undefined8 *local_1638;
  undefined1 (*local_1630) [32];
  undefined8 *local_1628;
  undefined1 (*local_1620) [32];
  undefined8 *local_1618;
  undefined1 (*local_1610) [32];
  undefined8 *local_1608;
  undefined1 (*local_1600) [32];
  undefined8 *local_15f8;
  undefined1 (*local_15f0) [32];
  undefined8 *local_15e8;
  undefined1 (*local_15e0) [32];
  undefined8 *local_15d8;
  undefined1 (*local_15d0) [32];
  undefined8 *local_15c8;
  undefined1 (*local_15c0) [32];
  undefined8 *local_15b8;
  undefined1 (*local_15b0) [32];
  undefined8 *local_15a8;
  undefined1 (*local_15a0) [32];
  undefined8 *local_1598;
  undefined1 (*local_1590) [32];
  undefined8 *local_1588;
  undefined1 (*local_1580) [32];
  undefined8 *local_1578;
  undefined1 (*local_1570) [32];
  undefined8 *local_1568;
  undefined1 (*local_1560) [32];
  undefined8 *local_1558;
  undefined1 (*local_1550) [32];
  undefined1 (*local_1548) [32];
  undefined8 *local_1540;
  undefined1 (*local_1538) [32];
  undefined1 (*local_1530) [32];
  int16_t *local_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  ushort local_115c;
  ushort local_115a;
  ushort local_1158;
  ushort local_1156;
  ushort local_1154;
  ushort local_1152;
  ushort local_1150;
  ushort local_114e;
  ushort local_114c;
  ushort local_114a;
  ushort local_1148;
  ushort local_1146;
  ushort local_1144;
  ushort local_1142;
  int64_t local_1140;
  int64_t iStack_1138;
  int64_t iStack_1130;
  int64_t iStack_1128;
  int64_t *local_1108;
  int64_t local_1100;
  int64_t iStack_10f8;
  int64_t iStack_10f0;
  int64_t iStack_10e8;
  int64_t *local_10c8;
  int64_t local_10c0;
  int64_t iStack_10b8;
  int64_t iStack_10b0;
  int64_t iStack_10a8;
  int64_t *local_1088;
  int64_t local_1080;
  int64_t iStack_1078;
  int64_t iStack_1070;
  int64_t iStack_1068;
  int64_t *local_1048;
  int64_t local_1040;
  int64_t iStack_1038;
  int64_t iStack_1030;
  int64_t iStack_1028;
  int64_t *local_1008;
  int64_t local_1000;
  int64_t iStack_ff8;
  int64_t iStack_ff0;
  int64_t iStack_fe8;
  int64_t *local_fc8;
  int64_t local_fc0;
  int64_t iStack_fb8;
  int64_t iStack_fb0;
  int64_t iStack_fa8;
  int64_t *local_f88;
  int64_t local_f80;
  int64_t iStack_f78;
  int64_t iStack_f70;
  int64_t iStack_f68;
  int64_t *local_f48;
  int64_t local_f40;
  int64_t iStack_f38;
  int64_t iStack_f30;
  int64_t iStack_f28;
  int64_t *local_f08;
  int64_t local_f00;
  int64_t iStack_ef8;
  int64_t iStack_ef0;
  int64_t iStack_ee8;
  int64_t *local_ec8;
  int64_t local_ec0;
  int64_t iStack_eb8;
  int64_t iStack_eb0;
  int64_t iStack_ea8;
  int64_t *local_e88;
  int64_t local_e80;
  int64_t iStack_e78;
  int64_t iStack_e70;
  int64_t iStack_e68;
  int64_t *local_e48;
  int64_t local_e40;
  int64_t iStack_e38;
  int64_t iStack_e30;
  int64_t iStack_e28;
  int64_t *local_e08;
  int64_t local_e00;
  int64_t iStack_df8;
  int64_t iStack_df0;
  int64_t iStack_de8;
  int64_t *local_dc8;
  int64_t local_dc0;
  int64_t iStack_db8;
  int64_t iStack_db0;
  int64_t iStack_da8;
  int64_t *local_d88;
  int64_t local_d80;
  int64_t iStack_d78;
  int64_t iStack_d70;
  int64_t iStack_d68;
  int64_t *local_d48;
  int64_t local_d40;
  int64_t iStack_d38;
  int64_t iStack_d30;
  int64_t iStack_d28;
  int64_t *local_d08;
  int64_t local_d00;
  int64_t iStack_cf8;
  int64_t iStack_cf0;
  int64_t iStack_ce8;
  int64_t *local_cc8;
  int64_t local_cc0;
  int64_t iStack_cb8;
  int64_t iStack_cb0;
  int64_t iStack_ca8;
  int64_t *local_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 *local_c48;
  undefined1 local_c40 [32];
  ushort local_c20;
  ushort local_c1e;
  ushort local_c1c;
  ushort local_c1a;
  ushort local_c18;
  ushort local_c16;
  ushort local_c14;
  ushort local_c12;
  ushort local_c10;
  ushort local_c0e;
  ushort local_c0c;
  ushort local_c0a;
  ushort local_c08;
  ushort local_c06;
  ushort local_c04;
  ushort local_c02;
  undefined1 local_c00 [32];
  ushort local_be0;
  ushort local_bde;
  ushort local_bdc;
  ushort local_bda;
  ushort local_bd8;
  ushort local_bd6;
  ushort local_bd4;
  ushort local_bd2;
  ushort local_bd0;
  ushort local_bce;
  ushort local_bcc;
  ushort local_bca;
  ushort local_bc8;
  ushort local_bc6;
  ushort local_bc4;
  ushort local_bc2;
  undefined1 local_bc0 [32];
  ushort local_ba0;
  ushort local_b9e;
  ushort local_b9c;
  ushort local_b9a;
  ushort local_b98;
  ushort local_b96;
  ushort local_b94;
  ushort local_b92;
  ushort local_b90;
  ushort local_b8e;
  ushort local_b8c;
  ushort local_b8a;
  ushort local_b88;
  ushort local_b86;
  ushort local_b84;
  ushort local_b82;
  undefined1 local_b80 [32];
  ushort local_b60;
  ushort local_b5e;
  ushort local_b5c;
  ushort local_b5a;
  ushort local_b58;
  ushort local_b56;
  ushort local_b54;
  ushort local_b52;
  ushort local_b50;
  ushort local_b4e;
  ushort local_b4c;
  ushort local_b4a;
  ushort local_b48;
  ushort local_b46;
  ushort local_b44;
  ushort local_b42;
  undefined1 local_b40 [32];
  ushort local_b20;
  ushort local_b1e;
  ushort local_b1c;
  ushort local_b1a;
  ushort local_b18;
  ushort local_b16;
  ushort local_b14;
  ushort local_b12;
  ushort local_b10;
  ushort local_b0e;
  ushort local_b0c;
  ushort local_b0a;
  ushort local_b08;
  ushort local_b06;
  ushort local_b04;
  ushort local_b02;
  undefined1 local_b00 [32];
  ushort local_ae0;
  ushort local_ade;
  ushort local_adc;
  ushort local_ada;
  ushort local_ad8;
  ushort local_ad6;
  ushort local_ad4;
  ushort local_ad2;
  ushort local_ad0;
  ushort local_ace;
  ushort local_acc;
  ushort local_aca;
  ushort local_ac8;
  ushort local_ac6;
  ushort local_ac4;
  ushort local_ac2;
  undefined1 local_ac0 [32];
  ushort local_aa0;
  ushort local_a9e;
  ushort local_a9c;
  ushort local_a9a;
  ushort local_a98;
  ushort local_a96;
  ushort local_a94;
  ushort local_a92;
  ushort local_a90;
  ushort local_a8e;
  ushort local_a8c;
  ushort local_a8a;
  ushort local_a88;
  ushort local_a86;
  ushort local_a84;
  ushort local_a82;
  undefined1 local_a80 [32];
  ushort local_a60;
  ushort local_a5e;
  ushort local_a5c;
  ushort local_a5a;
  ushort local_a58;
  ushort local_a56;
  ushort local_a54;
  ushort local_a52;
  ushort local_a50;
  ushort local_a4e;
  ushort local_a4c;
  ushort local_a4a;
  ushort local_a48;
  ushort local_a46;
  ushort local_a44;
  ushort local_a42;
  undefined1 local_a40 [32];
  ushort local_a20;
  ushort local_a1e;
  ushort local_a1c;
  ushort local_a1a;
  ushort local_a18;
  ushort local_a16;
  ushort local_a14;
  ushort local_a12;
  ushort local_a10;
  ushort local_a0e;
  ushort local_a0c;
  ushort local_a0a;
  ushort local_a08;
  ushort local_a06;
  ushort local_a04;
  ushort local_a02;
  undefined1 local_a00 [32];
  ushort local_9e0;
  ushort local_9de;
  ushort local_9dc;
  ushort local_9da;
  ushort local_9d8;
  ushort local_9d6;
  ushort local_9d4;
  ushort local_9d2;
  ushort local_9d0;
  ushort local_9ce;
  ushort local_9cc;
  ushort local_9ca;
  ushort local_9c8;
  ushort local_9c6;
  ushort local_9c4;
  ushort local_9c2;
  undefined1 local_9c0 [32];
  ushort local_9a0;
  ushort local_99e;
  ushort local_99c;
  ushort local_99a;
  ushort local_998;
  ushort local_996;
  ushort local_994;
  ushort local_992;
  ushort local_990;
  ushort local_98e;
  ushort local_98c;
  ushort local_98a;
  ushort local_988;
  ushort local_986;
  ushort local_984;
  ushort local_982;
  undefined1 local_980 [32];
  ushort local_960;
  ushort local_95e;
  ushort local_95c;
  ushort local_95a;
  ushort local_958;
  ushort local_956;
  ushort local_954;
  ushort local_952;
  ushort local_950;
  ushort local_94e;
  ushort local_94c;
  ushort local_94a;
  ushort local_948;
  ushort local_946;
  ushort local_944;
  ushort local_942;
  undefined1 local_940 [32];
  ushort local_920;
  ushort local_91e;
  ushort local_91c;
  ushort local_91a;
  ushort local_918;
  ushort local_916;
  ushort local_914;
  ushort local_912;
  ushort local_910;
  ushort local_90e;
  ushort local_90c;
  ushort local_90a;
  ushort local_908;
  ushort local_906;
  ushort local_904;
  ushort local_902;
  undefined1 local_900 [32];
  ushort local_8e0;
  ushort local_8de;
  ushort local_8dc;
  ushort local_8da;
  ushort local_8d8;
  ushort local_8d6;
  ushort local_8d4;
  ushort local_8d2;
  ushort local_8d0;
  ushort local_8ce;
  ushort local_8cc;
  ushort local_8ca;
  ushort local_8c8;
  ushort local_8c6;
  ushort local_8c4;
  ushort local_8c2;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  undefined1 auStack_670 [16];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  undefined1 auStack_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 auStack_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  undefined1 auStack_470 [16];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined1 auStack_430 [16];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  int64_t local_130;
  int64_t iStack_128;
  int64_t *local_118;
  int64_t local_110;
  int64_t iStack_108;
  int64_t *local_f8;
  int64_t local_f0;
  int64_t iStack_e8;
  int64_t *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 *local_b8;
  undefined8 local_b0;
  longlong lStack_a0;
  undefined8 *local_98;
  int64_t local_90;
  int64_t iStack_88;
  int64_t *local_78;
  undefined8 local_70;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 uStack_40;
  undefined8 *local_38;
  
  local_18c8 = 7;
  local_18cc = 0x31;
  local_18d0 = in_R8D & 0xfffffff0;
  local_18d4 = in_R8D - local_18d0;
  lVar46 = (long)(0x10 - local_18d4);
  local_1528 = mask_16bit + lVar46;
  local_1900 = *(undefined8 *)local_1528;
  uStack_18f8 = *(undefined8 *)(mask_16bit + lVar46 + 4);
  uStack_18f0 = *(undefined8 *)(mask_16bit + lVar46 + 8);
  uStack_18e8 = *(undefined8 *)(mask_16bit + lVar46 + 0xc);
  local_1908 = 0;
  local_18c4 = in_R9D;
  local_18bc = in_ECX;
  local_18b8 = in_RDX;
  local_18ac = in_ESI;
  local_18a8 = in_RDI;
  do {
    local_1910 = local_18b8;
    local_1918 = local_18a8;
    auVar55._16_16_ = ZEXT816(0) << 0x40;
    local_1940 = ZEXT1632(auVar55._16_16_);
    auVar69._16_8_ = 0;
    auVar69._0_16_ = auVar55._16_16_;
    uVar70 = 0;
    local_19c0 = ZEXT1632(auVar55._16_16_);
    local_1ac0 = ZEXT1632(auVar55._16_16_);
    local_17a0 = 0;
    uStack_1798 = 0;
    uStack_1790 = 0;
    uStack_1788 = 0;
    local_1a00 = ZEXT1632(ZEXT816(0));
    local_17c0 = 0;
    uStack_17b8 = 0;
    uStack_17b0 = 0;
    uStack_17a8 = 0;
    local_1ae0 = ZEXT1632(ZEXT816(0));
    local_1904 = 1;
    if ((int)H != 0) {
      local_1904 = 4;
    }
    local_1ae4 = local_18c4;
    local_37c0 = in_stack_ffffffffffffc620;
    iStack_37b8 = in_stack_ffffffffffffc628;
    lStack_37b0 = in_stack_ffffffffffffc630;
    local_1aa0 = local_1ac0;
    local_1a80 = local_1ac0;
    local_1a60 = local_1ac0;
    local_1a40 = local_1ac0;
    local_1a20 = local_1ac0;
    local_19e0 = local_1ac0;
    local_19a0 = local_19c0;
    local_1980 = local_19c0;
    local_1960 = local_19c0;
    do {
      local_1ae8 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_1ae4 < 4)) {
        local_1904 = in_stack_00000008 - local_1ae4;
      }
      local_1142 = (ushort)local_1904;
      local_c02 = (ushort)local_1904;
      local_c04 = (ushort)local_1904;
      local_c06 = (ushort)local_1904;
      local_c08 = (ushort)local_1904;
      local_c0a = (ushort)local_1904;
      local_c0c = (ushort)local_1904;
      local_c0e = (ushort)local_1904;
      local_c10 = (ushort)local_1904;
      local_c12 = (ushort)local_1904;
      local_c14 = (ushort)local_1904;
      local_c16 = (ushort)local_1904;
      local_c18 = (ushort)local_1904;
      local_c1a = (ushort)local_1904;
      local_c1c = (ushort)local_1904;
      local_c1e = (ushort)local_1904;
      local_c20 = (ushort)local_1904;
      auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
      auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
      local_c40._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
      local_c40._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
      uVar68 = (ushort)local_1904;
      local_1b20 = local_c40._0_16_;
      auStack_1b10 = local_c40._16_16_;
      while( true ) {
        if ((int)local_18d0 <= local_1ae8) break;
        local_1530 = (undefined1 (*) [32])(local_1910 + (long)local_1ae8 * 2);
        local_1b40 = *(undefined8 *)*local_1530;
        uStack_1b38 = *(undefined8 *)(*local_1530 + 8);
        uStack_1b30 = *(undefined8 *)(*local_1530 + 0x10);
        uStack_1b28 = *(undefined8 *)(*local_1530 + 0x18);
        local_1538 = (undefined1 (*) [32])(local_1918 + (long)local_1ae8 * 2);
        local_1b60 = *(undefined8 *)*local_1538;
        uStack_1b58 = *(undefined8 *)(*local_1538 + 8);
        uStack_1b50 = *(undefined8 *)(*local_1538 + 0x10);
        uStack_1b48 = *(undefined8 *)(*local_1538 + 0x18);
        auVar45._16_8_ = auStack_1b10._0_8_;
        auVar45._0_16_ = local_1b20;
        auVar45._24_8_ = auStack_1b10._8_8_;
        local_1b80 = vpmullw_avx2(*local_1530,auVar45);
        auVar44._16_8_ = auStack_1b10._0_8_;
        auVar44._0_16_ = local_1b20;
        auVar44._24_8_ = auStack_1b10._8_8_;
        local_1ba0 = vpmullw_avx2(*local_1538,auVar44);
        local_1a0 = local_1b60;
        uStack_198 = uStack_1b58;
        uStack_190 = uStack_1b50;
        uStack_188 = uStack_1b48;
        local_160 = local_1b40;
        uStack_158 = uStack_1b38;
        uStack_150 = uStack_1b30;
        uStack_148 = uStack_1b28;
        local_180 = local_1b20;
        auStack_170 = auStack_1b10;
        local_1c0 = local_1b20;
        auStack_1b0 = auStack_1b10;
        for (local_1ba4 = 0; local_1ba4 < 7; local_1ba4 = local_1ba4 + 1) {
          local_1540 = (undefined8 *)
                       (local_1918 + (long)local_1908 * 2 + (long)local_1ae8 * 2 +
                       (long)(local_1ba4 * local_18ac) * 2);
          local_1be0 = *local_1540;
          uStack_1bd8 = local_1540[1];
          uStack_1bd0 = local_1540[2];
          uStack_1bc8 = local_1540[3];
          src_00[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_00[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_00[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_00[1] = in_stack_ffffffffffffc5c0;
          src_00[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_00[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_00[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_00[3] = in_stack_ffffffffffffc5d0;
          dgd_28[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_28[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_28[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_28[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_28[1] = in_stack_ffffffffffffc5a0;
          dgd_28[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_28[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_28[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_28[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_00,dgd_28,in_stack_ffffffffffffc590);
          src_01[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_01[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_01[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_01[1] = in_stack_ffffffffffffc5c0;
          src_01[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_01[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_01[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_01[3] = in_stack_ffffffffffffc5d0;
          dgd_29[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_29[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_29[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_29[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_29[1] = in_stack_ffffffffffffc5a0;
          dgd_29[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_29[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_29[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_29[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_01,dgd_29,in_stack_ffffffffffffc590);
        }
        local_1ae8 = local_1ae8 + 0x10;
      }
      if (local_18d4 != 0) {
        local_1548 = (undefined1 (*) [32])(local_1910 + (long)local_1ae8 * 2);
        local_1c00 = *(undefined8 *)*local_1548;
        uStack_1bf8 = *(undefined8 *)(*local_1548 + 8);
        uStack_1bf0 = *(undefined8 *)(*local_1548 + 0x10);
        uStack_1be8 = *(undefined8 *)(*local_1548 + 0x18);
        local_1550 = (undefined1 (*) [32])(local_1918 + (long)local_1ae8 * 2);
        local_1c20 = *(undefined8 *)*local_1550;
        uStack_1c18 = *(undefined8 *)(*local_1550 + 8);
        uStack_1c10 = *(undefined8 *)(*local_1550 + 0x10);
        uStack_1c08 = *(undefined8 *)(*local_1550 + 0x18);
        local_11a0 = local_1900;
        uStack_1198 = uStack_18f8;
        uStack_1190 = uStack_18f0;
        uStack_1188 = uStack_18e8;
        auVar15._8_8_ = uStack_18f8;
        auVar15._0_8_ = local_1900;
        auVar15._16_8_ = uStack_18f0;
        auVar15._24_8_ = uStack_18e8;
        local_1c40 = vpand_avx2(*local_1548,auVar15);
        local_11e0 = local_1900;
        uStack_11d8 = uStack_18f8;
        uStack_11d0 = uStack_18f0;
        uStack_11c8 = uStack_18e8;
        auVar1._8_8_ = uStack_18f8;
        auVar1._0_8_ = local_1900;
        auVar1._16_8_ = uStack_18f0;
        auVar1._24_8_ = uStack_18e8;
        local_1c60 = vpand_avx2(*local_1550,auVar1);
        local_1e0 = local_1c40._0_8_;
        uStack_1d8 = local_1c40._8_8_;
        uStack_1d0 = local_1c40._16_8_;
        uStack_1c8 = local_1c40._24_8_;
        auVar43._16_8_ = auStack_1b10._0_8_;
        auVar43._0_16_ = local_1b20;
        auVar43._24_8_ = auStack_1b10._8_8_;
        local_1c80 = vpmullw_avx2(local_1c40,auVar43);
        local_220 = local_1c60._0_8_;
        uStack_218 = local_1c60._8_8_;
        uStack_210 = local_1c60._16_8_;
        uStack_208 = local_1c60._24_8_;
        auVar42._16_8_ = auStack_1b10._0_8_;
        auVar42._0_16_ = local_1b20;
        auVar42._24_8_ = auStack_1b10._8_8_;
        local_1ca0 = vpmullw_avx2(local_1c60,auVar42);
        local_11c0 = local_1c20;
        uStack_11b8 = uStack_1c18;
        uStack_11b0 = uStack_1c10;
        uStack_11a8 = uStack_1c08;
        local_1180 = local_1c00;
        uStack_1178 = uStack_1bf8;
        uStack_1170 = uStack_1bf0;
        uStack_1168 = uStack_1be8;
        local_200 = local_1b20;
        auStack_1f0 = auStack_1b10;
        local_240 = local_1b20;
        auStack_230 = auStack_1b10;
        for (local_1ca4 = 0; local_1ca4 < 7; local_1ca4 = local_1ca4 + 1) {
          local_1558 = (undefined8 *)
                       (local_1918 + (long)local_1908 * 2 + (long)local_1ae8 * 2 +
                       (long)(local_1ca4 * local_18ac) * 2);
          local_1ce0 = *local_1558;
          uStack_1cd8 = local_1558[1];
          uStack_1cd0 = local_1558[2];
          uStack_1cc8 = local_1558[3];
          src_02[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_02[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_02[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_02[1] = in_stack_ffffffffffffc5c0;
          src_02[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_02[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_02[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_02[3] = in_stack_ffffffffffffc5d0;
          dgd_30[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_30[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_30[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_30[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_30[1] = in_stack_ffffffffffffc5a0;
          dgd_30[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_30[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_30[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_30[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_02,dgd_30,in_stack_ffffffffffffc590);
          src_03[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_03[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_03[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_03[1] = in_stack_ffffffffffffc5c0;
          src_03[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_03[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_03[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_03[3] = in_stack_ffffffffffffc5d0;
          dgd_31[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_31[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_31[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_31[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_31[1] = in_stack_ffffffffffffc5a0;
          dgd_31[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_31[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_31[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_31[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_03,dgd_31,in_stack_ffffffffffffc590);
        }
      }
      local_1ae4 = local_1904 + local_1ae4;
      local_1910 = local_1910 + (long)(int)(local_1904 * local_18bc) * 2;
      local_1918 = local_1918 + (long)(int)(local_1904 * local_18ac) * 2;
    } while (local_1ae4 < in_stack_00000008);
    src0_00[1] = local_37c0;
    src0_00[0] = uVar70;
    src0_00[2] = iStack_37b8;
    src0_00[3] = lStack_37b0;
    src1_00[0]._6_2_ = uVar68;
    src1_00[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_00[1] = auVar69._0_8_;
    src1_00[2] = auVar69._8_8_;
    src1_00[3] = auVar69._16_8_;
    uVar49 = local_1a00._0_8_;
    uVar56 = local_1a00._8_8_;
    uVar60 = local_1a00._16_8_;
    uVar64 = local_1a00._24_8_;
    hadd_four_32_to_64_avx2
              (src0_00,src1_00,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    src0_01[1] = local_37c0;
    src0_01[0] = uVar70;
    src0_01[2] = iStack_37b8;
    src0_01[3] = lStack_37b0;
    src1_01[0]._6_2_ = uVar68;
    src1_01[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_01[1] = auVar69._0_8_;
    src1_01[2] = auVar69._8_8_;
    src1_01[3] = auVar69._16_8_;
    uVar50 = local_1980._0_8_;
    uVar57 = local_1980._8_8_;
    uVar61 = local_1980._16_8_;
    puVar48 = (undefined8 *)local_1980._24_8_;
    local_1d00 = uVar49;
    uStack_1cf8 = uVar56;
    uStack_1cf0 = uVar60;
    uStack_1ce8 = uVar64;
    hadd_four_32_to_64_avx2
              (src0_01,src1_01,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    local_c48 = (undefined8 *)(CONCAT44(in_stack_00000014,v_end) + (long)(local_1908 * 7) * 8);
    local_c80 = local_1d00;
    uStack_c78 = uStack_1cf8;
    uStack_c70 = uStack_1cf0;
    uStack_c68 = uStack_1ce8;
    *local_c48 = local_1d00;
    local_c48[1] = uStack_1cf8;
    local_c48[2] = uStack_1cf0;
    local_c48[3] = uStack_1ce8;
    local_b8 = (undefined8 *)(CONCAT44(in_stack_00000014,v_end) + 0x20 + (long)(local_1908 * 7) * 8)
    ;
    *local_b8 = uVar50;
    local_b8[1] = uVar57;
    *puVar48 = local_50;
    src0_02[1] = local_37c0;
    src0_02[0] = uVar70;
    src0_02[2] = iStack_37b8;
    src0_02[3] = lStack_37b0;
    src1_02[0]._6_2_ = uVar68;
    src1_02[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_02[1] = auVar69._0_8_;
    src1_02[2] = auVar69._8_8_;
    src1_02[3] = auVar69._16_8_;
    iVar51 = local_1ae0._0_8_;
    iVar58 = local_1ae0._8_8_;
    iVar62 = local_1ae0._16_8_;
    iVar65 = local_1ae0._24_8_;
    local_1d20 = uVar50;
    uStack_1d18 = uVar57;
    uStack_1d10 = uVar61;
    puStack_1d08 = puVar48;
    local_1720 = uVar50;
    uStack_1718 = uVar57;
    uStack_1710 = uVar61;
    puStack_1708 = puVar48;
    local_d0 = uVar50;
    uStack_c8 = uVar57;
    uStack_40 = uVar61;
    local_38 = puVar48;
    hadd_four_32_to_64_avx2
              (src0_02,src1_02,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    src0_03[1] = local_37c0;
    src0_03[0] = uVar70;
    src0_03[2] = iStack_37b8;
    src0_03[3] = lStack_37b0;
    src1_03[0]._6_2_ = uVar68;
    src1_03[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_03[1] = auVar69._0_8_;
    src1_03[2] = auVar69._8_8_;
    src1_03[3] = auVar69._16_8_;
    iVar52 = local_1a60._0_8_;
    iVar59 = local_1a60._8_8_;
    uVar49 = local_1a60._16_8_;
    puVar48 = (undefined8 *)local_1a60._24_8_;
    local_1d40 = iVar51;
    iStack_1d38 = iVar58;
    iStack_1d30 = iVar62;
    iStack_1d28 = iVar65;
    hadd_four_32_to_64_avx2
              (src0_03,src1_03,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    local_c88 = M + local_1908 * 7;
    local_cc0 = local_1d40;
    iStack_cb8 = iStack_1d38;
    iStack_cb0 = iStack_1d30;
    iStack_ca8 = iStack_1d28;
    *local_c88 = local_1d40;
    local_c88[1] = iStack_1d38;
    local_c88[2] = iStack_1d30;
    local_c88[3] = iStack_1d28;
    local_d8 = M + (long)(local_1908 * 7) + 4;
    *local_d8 = iVar52;
    local_d8[1] = iVar59;
    *puVar48 = local_70;
    local_1908 = local_1908 + 1;
    in_stack_ffffffffffffc620 = local_37c0;
    in_stack_ffffffffffffc628 = iStack_37b8;
    in_stack_ffffffffffffc630 = lStack_37b0;
    local_1d60 = iVar52;
    iStack_1d58 = iVar59;
    uStack_1d50 = uVar49;
    puStack_1d48 = puVar48;
    local_1740 = iVar52;
    iStack_1738 = iVar59;
    uStack_1730 = uVar49;
    puStack_1728 = puVar48;
    local_f0 = iVar52;
    iStack_e8 = iVar59;
    uStack_60 = uVar49;
    local_58 = puVar48;
  } while (local_1908 < 7);
  local_1d64 = 1;
  while( true ) {
    if (0x30 < local_1d64) break;
    local_1908 = local_1d64 / 7;
    local_1d70 = local_18a8 + (long)local_1908 * 2;
    in_stack_ffffffffffffc5f0 = (__m256i *)(local_18a8 + (long)local_1908 * 2);
    local_1d78 = (long)*in_stack_ffffffffffffc5f0 + (long)((local_1d64 % 7) * local_18ac) * 2;
    local_1d7c = local_18c4;
    local_1904 = 1;
    if ((int)H != 0) {
      local_1904 = 4;
    }
    memset(&local_1e60,0,0xe0);
    do {
      local_1e64 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_1d7c < 4)) {
        local_1904 = in_stack_00000008 - local_1d7c;
      }
      local_1144 = (ushort)local_1904;
      local_bc2 = (ushort)local_1904;
      local_bc4 = (ushort)local_1904;
      local_bc6 = (ushort)local_1904;
      local_bc8 = (ushort)local_1904;
      local_bca = (ushort)local_1904;
      local_bcc = (ushort)local_1904;
      local_bce = (ushort)local_1904;
      local_bd0 = (ushort)local_1904;
      local_bd2 = (ushort)local_1904;
      local_bd4 = (ushort)local_1904;
      local_bd6 = (ushort)local_1904;
      local_bd8 = (ushort)local_1904;
      local_bda = (ushort)local_1904;
      local_bdc = (ushort)local_1904;
      local_bde = (ushort)local_1904;
      local_be0 = (ushort)local_1904;
      auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
      auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
      local_c00._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
      local_c00._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
      in_stack_ffffffffffffc5ee = (ushort)local_1904;
      local_1ea0 = local_c00._0_16_;
      auStack_1e90 = local_c00._16_16_;
      while( true ) {
        if ((int)local_18d0 <= local_1e64) break;
        local_1560 = (undefined1 (*) [32])(local_1d78 + (long)local_1e64 * 2);
        local_1ec0 = *(undefined8 *)*local_1560;
        uStack_1eb8 = *(undefined8 *)(*local_1560 + 8);
        uStack_1eb0 = *(undefined8 *)(*local_1560 + 0x10);
        uStack_1ea8 = *(undefined8 *)(*local_1560 + 0x18);
        auVar41._16_8_ = auStack_1e90._0_8_;
        auVar41._0_16_ = local_1ea0;
        auVar41._24_8_ = auStack_1e90._8_8_;
        local_1ee0 = vpmullw_avx2(*local_1560,auVar41);
        local_260 = local_1ec0;
        uStack_258 = uStack_1eb8;
        uStack_250 = uStack_1eb0;
        uStack_248 = uStack_1ea8;
        local_280 = local_1ea0;
        auStack_270 = auStack_1e90;
        for (local_1ee4 = 0; local_1ee4 < 6; local_1ee4 = local_1ee4 + 1) {
          local_1568 = (undefined8 *)
                       (local_1d70 + (long)local_1e64 * 2 + (long)local_18ac * 2 +
                       (long)(local_1ee4 * local_18ac) * 2);
          local_1f20 = *local_1568;
          uStack_1f18 = local_1568[1];
          uStack_1f10 = local_1568[2];
          uStack_1f08 = local_1568[3];
          src_04[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_04[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_04[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_04[1] = in_stack_ffffffffffffc5c0;
          src_04[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_04[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_04[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_04[3] = in_stack_ffffffffffffc5d0;
          dgd_32[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_32[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_32[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_32[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_32[1] = in_stack_ffffffffffffc5a0;
          dgd_32[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_32[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_32[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_32[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_04,dgd_32,in_stack_ffffffffffffc590);
        }
        local_1e64 = local_1e64 + 0x10;
      }
      if (local_18d4 != 0) {
        local_1570 = (undefined1 (*) [32])(local_1d78 + (long)local_1e64 * 2);
        local_1f40 = *(undefined8 *)*local_1570;
        uStack_1f38 = *(undefined8 *)(*local_1570 + 8);
        uStack_1f30 = *(undefined8 *)(*local_1570 + 0x10);
        uStack_1f28 = *(undefined8 *)(*local_1570 + 0x18);
        local_1220 = local_1900;
        uStack_1218 = uStack_18f8;
        uStack_1210 = uStack_18f0;
        uStack_1208 = uStack_18e8;
        auVar14._8_8_ = uStack_18f8;
        auVar14._0_8_ = local_1900;
        auVar14._16_8_ = uStack_18f0;
        auVar14._24_8_ = uStack_18e8;
        local_1f60 = vpand_avx2(*local_1570,auVar14);
        local_2a0 = local_1f60._0_8_;
        uStack_298 = local_1f60._8_8_;
        uStack_290 = local_1f60._16_8_;
        uStack_288 = local_1f60._24_8_;
        auVar40._16_8_ = auStack_1e90._0_8_;
        auVar40._0_16_ = local_1ea0;
        auVar40._24_8_ = auStack_1e90._8_8_;
        local_1f80 = vpmullw_avx2(local_1f60,auVar40);
        local_1200 = local_1f40;
        uStack_11f8 = uStack_1f38;
        uStack_11f0 = uStack_1f30;
        uStack_11e8 = uStack_1f28;
        local_2c0 = local_1ea0;
        auStack_2b0 = auStack_1e90;
        for (local_1f84 = 0; local_1f84 < 6; local_1f84 = local_1f84 + 1) {
          local_1578 = (undefined8 *)
                       (local_1d70 + (long)local_1e64 * 2 + (long)local_18ac * 2 +
                       (long)(local_1f84 * local_18ac) * 2);
          local_1fc0 = *local_1578;
          uStack_1fb8 = local_1578[1];
          uStack_1fb0 = local_1578[2];
          uStack_1fa8 = local_1578[3];
          src_05[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_05[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_05[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_05[1] = in_stack_ffffffffffffc5c0;
          src_05[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_05[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_05[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_05[3] = in_stack_ffffffffffffc5d0;
          dgd_33[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_33[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_33[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_33[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_33[1] = in_stack_ffffffffffffc5a0;
          dgd_33[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_33[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_33[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_33[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_05,dgd_33,in_stack_ffffffffffffc590);
        }
      }
      local_1d7c = local_1904 + local_1d7c;
      local_1d70 = local_1d70 + (long)(int)(local_1904 * local_18ac) * 2;
      local_1d78 = local_1d78 + (long)(int)(local_1904 * local_18ac) * 2;
    } while (local_1d7c < in_stack_00000008);
    src0_04[1] = local_37c0;
    src0_04[0] = uVar70;
    src0_04[2] = iStack_37b8;
    src0_04[3] = lStack_37b0;
    src1_04[0]._6_2_ = uVar68;
    src1_04[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_04[1] = auVar69._0_8_;
    src1_04[2] = auVar69._8_8_;
    src1_04[3] = auVar69._16_8_;
    iVar51 = local_1e60;
    iVar58 = iStack_1e58;
    iVar62 = iStack_1e50;
    iVar65 = iStack_1e48;
    hadd_four_32_to_64_avx2
              (src0_04,src1_04,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    local_cc8 = M + (long)(local_1d64 * 0x31) + (long)local_1d64;
    *local_cc8 = iVar51;
    local_cc8[1] = iVar58;
    local_cc8[2] = iVar62;
    local_cc8[3] = iVar65;
    src0[0]._4_2_ = in_stack_ffffffffffffc5dc;
    src0[0]._0_4_ = in_stack_ffffffffffffc5d8;
    src0[0]._6_2_ = in_stack_ffffffffffffc5de;
    src0[1] = in_stack_ffffffffffffc5e0;
    src0[2]._0_4_ = in_stack_ffffffffffffc5e8;
    src0[2]._4_2_ = in_stack_ffffffffffffc5ec;
    src0[2]._6_2_ = in_stack_ffffffffffffc5ee;
    src0[3] = (longlong)in_stack_ffffffffffffc5f0;
    src1[0]._4_2_ = in_stack_ffffffffffffc5bc;
    src1[0]._0_4_ = in_stack_ffffffffffffc5b8;
    src1[0]._6_2_ = in_stack_ffffffffffffc5be;
    src1[1] = in_stack_ffffffffffffc5c0;
    src1[2]._0_4_ = in_stack_ffffffffffffc5c8;
    src1[2]._4_2_ = in_stack_ffffffffffffc5cc;
    src1[2]._6_2_ = in_stack_ffffffffffffc5ce;
    src1[3] = in_stack_ffffffffffffc5d0;
    iVar52 = local_1de0;
    iVar59 = iStack_1dd8;
    local_1fe0 = iVar51;
    iStack_1fd8 = iVar58;
    iStack_1fd0 = iVar62;
    iStack_1fc8 = iVar65;
    local_d00 = iVar51;
    iStack_cf8 = iVar58;
    iStack_cf0 = iVar62;
    iStack_ce8 = iVar65;
    convert_32_to_64_add_avx2(src0,src1);
    local_f8 = M + (long)(local_1d64 * 0x31) + (long)local_1d64 + 4;
    *local_f8 = iVar52;
    M[(long)(local_1d64 * 0x31) + (long)local_1d64 + 5] = iVar59;
    local_1ff0 = iVar52;
    iStack_1fe8 = iVar59;
    local_110 = iVar52;
    iStack_108 = iVar59;
    while (local_1908 = local_1908 + 1, local_1908 < 7) {
      local_1d70 = local_18a8;
      local_1d78 = local_18a8 + (long)(local_1d64 / 7) * 2 +
                   (long)((local_1d64 % 7) * local_18ac) * 2;
      local_17e0 = 0;
      uStack_17d8 = 0;
      uStack_17d0 = 0;
      uStack_17c8 = 0;
      local_2020 = 0;
      uStack_2018 = 0;
      uStack_2010 = 0;
      uStack_2008 = 0;
      local_1e60 = 0;
      iStack_1e58 = 0;
      iStack_1e50 = 0;
      iStack_1e48 = 0;
      local_1e40 = 0;
      uStack_1e38 = 0;
      uStack_1e30 = 0;
      uStack_1e28 = 0;
      local_1e20 = 0;
      uStack_1e18 = 0;
      uStack_1e10 = 0;
      uStack_1e08 = 0;
      local_1e00 = 0;
      uStack_1df8 = 0;
      uStack_1df0 = 0;
      uStack_1de8 = 0;
      local_1de0 = 0;
      iStack_1dd8 = 0;
      iStack_1dd0 = 0;
      iStack_1dc8 = 0;
      local_1dc0 = 0;
      uStack_1db8 = 0;
      uStack_1db0 = 0;
      uStack_1da8 = 0;
      local_1da0 = 0;
      uStack_1d98 = 0;
      uStack_1d90 = 0;
      uStack_1d88 = 0;
      local_1d7c = local_18c4;
      local_1904 = 1;
      if ((int)H != 0) {
        local_1904 = 4;
      }
      do {
        local_2024 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_1d7c < 4)) {
          local_1904 = in_stack_00000008 - local_1d7c;
        }
        local_1146 = (ushort)local_1904;
        local_b82 = (ushort)local_1904;
        local_b84 = (ushort)local_1904;
        local_b86 = (ushort)local_1904;
        local_b88 = (ushort)local_1904;
        local_b8a = (ushort)local_1904;
        local_b8c = (ushort)local_1904;
        local_b8e = (ushort)local_1904;
        local_b90 = (ushort)local_1904;
        local_b92 = (ushort)local_1904;
        local_b94 = (ushort)local_1904;
        local_b96 = (ushort)local_1904;
        local_b98 = (ushort)local_1904;
        local_b9a = (ushort)local_1904;
        local_b9c = (ushort)local_1904;
        local_b9e = (ushort)local_1904;
        local_ba0 = (ushort)local_1904;
        auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
        auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
        local_bc0._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
        local_bc0._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
        in_stack_ffffffffffffc5ec = (ushort)local_1904;
        local_2060 = local_bc0._0_16_;
        auStack_2050 = local_bc0._16_16_;
        while( true ) {
          if ((int)local_18d0 <= local_2024) break;
          local_1580 = (undefined1 (*) [32])(local_1d78 + (long)local_2024 * 2);
          local_2080 = *(undefined8 *)*local_1580;
          uStack_2078 = *(undefined8 *)(*local_1580 + 8);
          uStack_2070 = *(undefined8 *)(*local_1580 + 0x10);
          uStack_2068 = *(undefined8 *)(*local_1580 + 0x18);
          auVar39._16_8_ = auStack_2050._0_8_;
          auVar39._0_16_ = local_2060;
          auVar39._24_8_ = auStack_2050._8_8_;
          local_20a0 = vpmullw_avx2(*local_1580,auVar39);
          local_2e0 = local_2080;
          uStack_2d8 = uStack_2078;
          uStack_2d0 = uStack_2070;
          uStack_2c8 = uStack_2068;
          local_300 = local_2060;
          auStack_2f0 = auStack_2050;
          for (local_20a4 = 0; local_20a4 < 7; local_20a4 = local_20a4 + 1) {
            local_1588 = (undefined8 *)
                         (local_1d70 + (long)local_1908 * 2 + (long)local_2024 * 2 +
                         (long)(local_20a4 * local_18ac) * 2);
            local_20e0 = *local_1588;
            uStack_20d8 = local_1588[1];
            uStack_20d0 = local_1588[2];
            uStack_20c8 = local_1588[3];
            src_06[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_06[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_06[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_06[1] = in_stack_ffffffffffffc5c0;
            src_06[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_06[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_06[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_06[3] = in_stack_ffffffffffffc5d0;
            dgd_34[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_34[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_34[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_34[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_34[1] = in_stack_ffffffffffffc5a0;
            dgd_34[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_34[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_34[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_34[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_06,dgd_34,in_stack_ffffffffffffc590);
          }
          local_2024 = local_2024 + 0x10;
        }
        if (local_18d4 != 0) {
          local_1590 = (undefined1 (*) [32])(local_1d78 + (long)local_2024 * 2);
          local_2100 = *(undefined8 *)*local_1590;
          uStack_20f8 = *(undefined8 *)(*local_1590 + 8);
          uStack_20f0 = *(undefined8 *)(*local_1590 + 0x10);
          uStack_20e8 = *(undefined8 *)(*local_1590 + 0x18);
          local_1260 = local_1900;
          uStack_1258 = uStack_18f8;
          uStack_1250 = uStack_18f0;
          uStack_1248 = uStack_18e8;
          auVar13._8_8_ = uStack_18f8;
          auVar13._0_8_ = local_1900;
          auVar13._16_8_ = uStack_18f0;
          auVar13._24_8_ = uStack_18e8;
          local_2120 = vpand_avx2(*local_1590,auVar13);
          local_320 = local_2120._0_8_;
          uStack_318 = local_2120._8_8_;
          uStack_310 = local_2120._16_8_;
          uStack_308 = local_2120._24_8_;
          auVar38._16_8_ = auStack_2050._0_8_;
          auVar38._0_16_ = local_2060;
          auVar38._24_8_ = auStack_2050._8_8_;
          local_2140 = vpmullw_avx2(local_2120,auVar38);
          local_1240 = local_2100;
          uStack_1238 = uStack_20f8;
          uStack_1230 = uStack_20f0;
          uStack_1228 = uStack_20e8;
          local_340 = local_2060;
          auStack_330 = auStack_2050;
          for (local_2144 = 0; local_2144 < 7; local_2144 = local_2144 + 1) {
            local_1598 = (undefined8 *)
                         (local_1d70 + (long)local_1908 * 2 + (long)local_2024 * 2 +
                         (long)(local_2144 * local_18ac) * 2);
            local_2180 = *local_1598;
            uStack_2178 = local_1598[1];
            uStack_2170 = local_1598[2];
            uStack_2168 = local_1598[3];
            src_07[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_07[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_07[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_07[1] = in_stack_ffffffffffffc5c0;
            src_07[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_07[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_07[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_07[3] = in_stack_ffffffffffffc5d0;
            dgd_35[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_35[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_35[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_35[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_35[1] = in_stack_ffffffffffffc5a0;
            dgd_35[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_35[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_35[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_35[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_07,dgd_35,in_stack_ffffffffffffc590);
          }
        }
        local_1d7c = local_1904 + local_1d7c;
        local_1d70 = local_1d70 + (long)(int)(local_1904 * local_18ac) * 2;
        local_1d78 = local_1d78 + (long)(int)(local_1904 * local_18ac) * 2;
      } while (local_1d7c < in_stack_00000008);
      src0_05[1] = local_37c0;
      src0_05[0] = uVar70;
      src0_05[2] = iStack_37b8;
      src0_05[3] = lStack_37b0;
      src1_05[0]._6_2_ = uVar68;
      src1_05[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_05[1] = auVar69._0_8_;
      src1_05[2] = auVar69._8_8_;
      src1_05[3] = auVar69._16_8_;
      iVar51 = local_1e60;
      iVar58 = iStack_1e58;
      iVar62 = iStack_1e50;
      iVar65 = iStack_1e48;
      hadd_four_32_to_64_avx2
                (src0_05,src1_05,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      local_d08 = M + (long)(local_1d64 * 0x31) + (long)(local_1908 * 7);
      *local_d08 = iVar51;
      local_d08[1] = iVar58;
      local_d08[2] = iVar62;
      local_d08[3] = iVar65;
      src0_06[1] = local_37c0;
      src0_06[0] = uVar70;
      src0_06[2] = iStack_37b8;
      src0_06[3] = lStack_37b0;
      src1_06[0]._6_2_ = uVar68;
      src1_06[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_06[1] = auVar69._0_8_;
      src1_06[2] = auVar69._8_8_;
      src1_06[3] = auVar69._16_8_;
      iVar52 = local_1de0;
      iVar59 = iStack_1dd8;
      iVar63 = iStack_1dd0;
      iVar66 = iStack_1dc8;
      local_21a0 = iVar51;
      iStack_2198 = iVar58;
      iStack_2190 = iVar62;
      iStack_2188 = iVar65;
      local_d40 = iVar51;
      iStack_d38 = iVar58;
      iStack_d30 = iVar62;
      iStack_d28 = iVar65;
      hadd_four_32_to_64_avx2
                (src0_06,src1_06,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      lVar46 = (long)(local_1d64 * 0x31);
      lVar47 = (long)(local_1908 * 7);
      local_d48 = M + lVar46 + lVar47 + 4;
      *local_d48 = iVar52;
      M[lVar46 + lVar47 + 5] = iVar59;
      M[lVar46 + lVar47 + 6] = iVar63;
      M[lVar46 + lVar47 + 7] = iVar66;
      local_21c0 = iVar52;
      iStack_21b8 = iVar59;
      iStack_21b0 = iVar63;
      iStack_21a8 = iVar66;
      local_d80 = iVar52;
      iStack_d78 = iVar59;
      iStack_d70 = iVar63;
      iStack_d68 = iVar66;
    }
    local_1d64 = local_1d64 + 7;
  }
  local_21c4 = 2;
  while( true ) {
    if (0x30 < local_21c4) break;
    local_1908 = local_21c4 / 7;
    local_21d0 = local_18a8 + (long)local_1908 * 2;
    local_21d8 = local_18a8 + (long)local_1908 * 2 + (long)((local_21c4 % 7) * local_18ac) * 2;
    local_21dc = local_18c4;
    local_1904 = 1;
    if ((int)H != 0) {
      local_1904 = 4;
    }
    memset(&local_22c0,0,0xe0);
    do {
      local_22c4 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_21dc < 4)) {
        local_1904 = in_stack_00000008 - local_21dc;
      }
      local_1148 = (ushort)local_1904;
      local_b42 = (ushort)local_1904;
      local_b44 = (ushort)local_1904;
      local_b46 = (ushort)local_1904;
      local_b48 = (ushort)local_1904;
      local_b4a = (ushort)local_1904;
      local_b4c = (ushort)local_1904;
      local_b4e = (ushort)local_1904;
      local_b50 = (ushort)local_1904;
      local_b52 = (ushort)local_1904;
      local_b54 = (ushort)local_1904;
      local_b56 = (ushort)local_1904;
      local_b58 = (ushort)local_1904;
      local_b5a = (ushort)local_1904;
      local_b5c = (ushort)local_1904;
      local_b5e = (ushort)local_1904;
      local_b60 = (ushort)local_1904;
      auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
      auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
      local_b80._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
      local_b80._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
      local_2300 = local_b80._0_16_;
      auStack_22f0 = local_b80._16_16_;
      while( true ) {
        if ((int)local_18d0 <= local_22c4) break;
        local_15a0 = (undefined1 (*) [32])(local_21d8 + (long)local_22c4 * 2);
        local_2320 = *(undefined8 *)*local_15a0;
        uStack_2318 = *(undefined8 *)(*local_15a0 + 8);
        uStack_2310 = *(undefined8 *)(*local_15a0 + 0x10);
        uStack_2308 = *(undefined8 *)(*local_15a0 + 0x18);
        auVar37._16_8_ = auStack_22f0._0_8_;
        auVar37._0_16_ = local_2300;
        auVar37._24_8_ = auStack_22f0._8_8_;
        local_2340 = vpmullw_avx2(*local_15a0,auVar37);
        local_360 = local_2320;
        uStack_358 = uStack_2318;
        uStack_350 = uStack_2310;
        uStack_348 = uStack_2308;
        local_380 = local_2300;
        auStack_370 = auStack_22f0;
        for (local_2344 = 0; local_2344 < 5; local_2344 = local_2344 + 1) {
          local_15a8 = (undefined8 *)
                       (local_21d0 + (long)local_22c4 * 2 + (long)(local_18ac << 1) * 2 +
                       (long)(local_2344 * local_18ac) * 2);
          local_2380 = *local_15a8;
          uStack_2378 = local_15a8[1];
          uStack_2370 = local_15a8[2];
          uStack_2368 = local_15a8[3];
          src_08[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_08[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_08[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_08[1] = in_stack_ffffffffffffc5c0;
          src_08[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_08[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_08[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_08[3] = in_stack_ffffffffffffc5d0;
          dgd_36[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_36[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_36[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_36[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_36[1] = in_stack_ffffffffffffc5a0;
          dgd_36[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_36[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_36[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_36[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_08,dgd_36,in_stack_ffffffffffffc590);
        }
        local_22c4 = local_22c4 + 0x10;
      }
      if (local_18d4 != 0) {
        local_15b0 = (undefined1 (*) [32])(local_21d8 + (long)local_22c4 * 2);
        local_23a0 = *(undefined8 *)*local_15b0;
        uStack_2398 = *(undefined8 *)(*local_15b0 + 8);
        uStack_2390 = *(undefined8 *)(*local_15b0 + 0x10);
        uStack_2388 = *(undefined8 *)(*local_15b0 + 0x18);
        local_12a0 = local_1900;
        uStack_1298 = uStack_18f8;
        uStack_1290 = uStack_18f0;
        uStack_1288 = uStack_18e8;
        auVar12._8_8_ = uStack_18f8;
        auVar12._0_8_ = local_1900;
        auVar12._16_8_ = uStack_18f0;
        auVar12._24_8_ = uStack_18e8;
        local_23c0 = vpand_avx2(*local_15b0,auVar12);
        local_3a0 = local_23c0._0_8_;
        uStack_398 = local_23c0._8_8_;
        uStack_390 = local_23c0._16_8_;
        uStack_388 = local_23c0._24_8_;
        auVar36._16_8_ = auStack_22f0._0_8_;
        auVar36._0_16_ = local_2300;
        auVar36._24_8_ = auStack_22f0._8_8_;
        local_23e0 = vpmullw_avx2(local_23c0,auVar36);
        local_1280 = local_23a0;
        uStack_1278 = uStack_2398;
        uStack_1270 = uStack_2390;
        uStack_1268 = uStack_2388;
        local_3c0 = local_2300;
        auStack_3b0 = auStack_22f0;
        for (local_23e4 = 0; local_23e4 < 5; local_23e4 = local_23e4 + 1) {
          local_15b8 = (undefined8 *)
                       (local_21d0 + (long)local_22c4 * 2 + (long)(local_18ac << 1) * 2 +
                       (long)(local_23e4 * local_18ac) * 2);
          local_2420 = *local_15b8;
          uStack_2418 = local_15b8[1];
          uStack_2410 = local_15b8[2];
          uStack_2408 = local_15b8[3];
          src_09[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_09[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_09[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_09[1] = in_stack_ffffffffffffc5c0;
          src_09[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_09[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_09[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_09[3] = in_stack_ffffffffffffc5d0;
          dgd_37[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_37[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_37[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_37[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_37[1] = in_stack_ffffffffffffc5a0;
          dgd_37[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_37[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_37[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_37[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_09,dgd_37,in_stack_ffffffffffffc590);
        }
      }
      local_21dc = local_1904 + local_21dc;
      local_21d0 = local_21d0 + (long)(int)(local_1904 * local_18ac) * 2;
      local_21d8 = local_21d8 + (long)(int)(local_1904 * local_18ac) * 2;
    } while (local_21dc < in_stack_00000008);
    src0_07[1] = local_37c0;
    src0_07[0] = uVar70;
    src0_07[2] = iStack_37b8;
    src0_07[3] = lStack_37b0;
    src1_07[0]._6_2_ = uVar68;
    src1_07[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_07[1] = auVar69._0_8_;
    src1_07[2] = auVar69._8_8_;
    src1_07[3] = auVar69._16_8_;
    iVar51 = local_22c0;
    iVar58 = iStack_22b8;
    iVar62 = iStack_22b0;
    iVar65 = iStack_22a8;
    hadd_four_32_to_64_avx2
              (src0_07,src1_07,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    local_d88 = M + (long)(local_21c4 * 0x31) + (long)local_21c4;
    *local_d88 = iVar51;
    local_d88[1] = iVar58;
    local_d88[2] = iVar62;
    local_d88[3] = iVar65;
    src_10[0]._4_2_ = in_stack_ffffffffffffc5bc;
    src_10[0]._0_4_ = in_stack_ffffffffffffc5b8;
    src_10[0]._6_2_ = in_stack_ffffffffffffc5be;
    src_10[1] = in_stack_ffffffffffffc5c0;
    src_10[2]._0_4_ = in_stack_ffffffffffffc5c8;
    src_10[2]._4_2_ = in_stack_ffffffffffffc5cc;
    src_10[2]._6_2_ = in_stack_ffffffffffffc5ce;
    src_10[3] = in_stack_ffffffffffffc5d0;
    iVar52 = local_2240;
    iVar59 = iStack_2238;
    iVar63 = iStack_2230;
    iVar66 = iStack_2228;
    local_2440 = iVar51;
    iStack_2438 = iVar58;
    iStack_2430 = iVar62;
    iStack_2428 = iVar65;
    local_dc0 = iVar51;
    iStack_db8 = iVar58;
    iStack_db0 = iVar62;
    iStack_da8 = iVar65;
    convert_and_add_avx2(src_10);
    src0_08[1] = local_37c0;
    src0_08[0] = uVar70;
    src0_08[2] = iStack_37b8;
    src0_08[3] = lStack_37b0;
    src1_08[0]._6_2_ = uVar68;
    src1_08[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_08[1] = auVar69._0_8_;
    src1_08[2] = auVar69._8_8_;
    src1_08[3] = auVar69._16_8_;
    local_2460 = iVar52;
    iStack_2458 = iVar59;
    iStack_2450 = iVar63;
    iStack_2448 = iVar66;
    add_64bit_lvl_avx2(src0_08,src1_08);
    local_78 = M + (long)(local_21c4 * 0x31) + (long)local_21c4 + 4;
    *local_78 = iVar52;
    local_2470 = iVar52;
    iStack_2468 = iVar59;
    local_90 = iVar52;
    iStack_88 = iVar59;
    while (local_1908 = local_1908 + 1, local_1908 < 7) {
      local_21d0 = local_18a8;
      local_21d8 = local_18a8 + (long)(local_21c4 / 7) * 2 +
                   (long)((local_21c4 % 7) * local_18ac) * 2;
      local_1800 = 0;
      uStack_17f8 = 0;
      uStack_17f0 = 0;
      uStack_17e8 = 0;
      local_24a0 = 0;
      uStack_2498 = 0;
      uStack_2490 = 0;
      uStack_2488 = 0;
      local_22c0 = 0;
      iStack_22b8 = 0;
      iStack_22b0 = 0;
      iStack_22a8 = 0;
      local_22a0 = 0;
      uStack_2298 = 0;
      uStack_2290 = 0;
      uStack_2288 = 0;
      local_2280 = 0;
      uStack_2278 = 0;
      uStack_2270 = 0;
      uStack_2268 = 0;
      local_2260 = 0;
      uStack_2258 = 0;
      uStack_2250 = 0;
      uStack_2248 = 0;
      local_2240 = 0;
      iStack_2238 = 0;
      iStack_2230 = 0;
      iStack_2228 = 0;
      local_2220 = 0;
      uStack_2218 = 0;
      uStack_2210 = 0;
      uStack_2208 = 0;
      local_2200 = 0;
      uStack_21f8 = 0;
      uStack_21f0 = 0;
      uStack_21e8 = 0;
      local_21dc = local_18c4;
      local_1904 = 1;
      if ((int)H != 0) {
        local_1904 = 4;
      }
      do {
        local_24a4 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_21dc < 4)) {
          local_1904 = in_stack_00000008 - local_21dc;
        }
        local_114a = (ushort)local_1904;
        local_b02 = (ushort)local_1904;
        local_b04 = (ushort)local_1904;
        local_b06 = (ushort)local_1904;
        local_b08 = (ushort)local_1904;
        local_b0a = (ushort)local_1904;
        local_b0c = (ushort)local_1904;
        local_b0e = (ushort)local_1904;
        local_b10 = (ushort)local_1904;
        local_b12 = (ushort)local_1904;
        local_b14 = (ushort)local_1904;
        local_b16 = (ushort)local_1904;
        local_b18 = (ushort)local_1904;
        local_b1a = (ushort)local_1904;
        local_b1c = (ushort)local_1904;
        local_b1e = (ushort)local_1904;
        local_b20 = (ushort)local_1904;
        auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
        auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
        local_b40._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
        local_b40._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
        local_24e0 = local_b40._0_16_;
        auStack_24d0 = local_b40._16_16_;
        while( true ) {
          if ((int)local_18d0 <= local_24a4) break;
          local_15c0 = (undefined1 (*) [32])(local_21d8 + (long)local_24a4 * 2);
          local_2500 = *(undefined8 *)*local_15c0;
          uStack_24f8 = *(undefined8 *)(*local_15c0 + 8);
          uStack_24f0 = *(undefined8 *)(*local_15c0 + 0x10);
          uStack_24e8 = *(undefined8 *)(*local_15c0 + 0x18);
          auVar35._16_8_ = auStack_24d0._0_8_;
          auVar35._0_16_ = local_24e0;
          auVar35._24_8_ = auStack_24d0._8_8_;
          local_2520 = vpmullw_avx2(*local_15c0,auVar35);
          local_3e0 = local_2500;
          uStack_3d8 = uStack_24f8;
          uStack_3d0 = uStack_24f0;
          uStack_3c8 = uStack_24e8;
          local_400 = local_24e0;
          auStack_3f0 = auStack_24d0;
          for (local_2524 = 0; local_2524 < 7; local_2524 = local_2524 + 1) {
            local_15c8 = (undefined8 *)
                         (local_21d0 + (long)local_1908 * 2 + (long)local_24a4 * 2 +
                         (long)(local_2524 * local_18ac) * 2);
            local_2560 = *local_15c8;
            uStack_2558 = local_15c8[1];
            uStack_2550 = local_15c8[2];
            uStack_2548 = local_15c8[3];
            src_11[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_11[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_11[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_11[1] = in_stack_ffffffffffffc5c0;
            src_11[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_11[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_11[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_11[3] = in_stack_ffffffffffffc5d0;
            dgd_38[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_38[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_38[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_38[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_38[1] = in_stack_ffffffffffffc5a0;
            dgd_38[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_38[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_38[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_38[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_11,dgd_38,in_stack_ffffffffffffc590);
          }
          local_24a4 = local_24a4 + 0x10;
        }
        if (local_18d4 != 0) {
          local_15d0 = (undefined1 (*) [32])(local_21d8 + (long)local_24a4 * 2);
          local_2580 = *(undefined8 *)*local_15d0;
          uStack_2578 = *(undefined8 *)(*local_15d0 + 8);
          uStack_2570 = *(undefined8 *)(*local_15d0 + 0x10);
          uStack_2568 = *(undefined8 *)(*local_15d0 + 0x18);
          local_12e0 = local_1900;
          uStack_12d8 = uStack_18f8;
          uStack_12d0 = uStack_18f0;
          uStack_12c8 = uStack_18e8;
          auVar11._8_8_ = uStack_18f8;
          auVar11._0_8_ = local_1900;
          auVar11._16_8_ = uStack_18f0;
          auVar11._24_8_ = uStack_18e8;
          local_25a0 = vpand_avx2(*local_15d0,auVar11);
          local_420 = local_25a0._0_8_;
          uStack_418 = local_25a0._8_8_;
          uStack_410 = local_25a0._16_8_;
          uStack_408 = local_25a0._24_8_;
          auVar34._16_8_ = auStack_24d0._0_8_;
          auVar34._0_16_ = local_24e0;
          auVar34._24_8_ = auStack_24d0._8_8_;
          local_25c0 = vpmullw_avx2(local_25a0,auVar34);
          local_12c0 = local_2580;
          uStack_12b8 = uStack_2578;
          uStack_12b0 = uStack_2570;
          uStack_12a8 = uStack_2568;
          local_440 = local_24e0;
          auStack_430 = auStack_24d0;
          for (local_25c4 = 0; local_25c4 < 7; local_25c4 = local_25c4 + 1) {
            local_15d8 = (undefined8 *)
                         (local_21d0 + (long)local_1908 * 2 + (long)local_24a4 * 2 +
                         (long)(local_25c4 * local_18ac) * 2);
            local_2600 = *local_15d8;
            uStack_25f8 = local_15d8[1];
            uStack_25f0 = local_15d8[2];
            uStack_25e8 = local_15d8[3];
            src_12[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_12[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_12[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_12[1] = in_stack_ffffffffffffc5c0;
            src_12[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_12[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_12[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_12[3] = in_stack_ffffffffffffc5d0;
            dgd_39[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_39[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_39[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_39[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_39[1] = in_stack_ffffffffffffc5a0;
            dgd_39[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_39[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_39[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_39[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_12,dgd_39,in_stack_ffffffffffffc590);
          }
        }
        local_21dc = local_1904 + local_21dc;
        local_21d0 = local_21d0 + (long)(int)(local_1904 * local_18ac) * 2;
        local_21d8 = local_21d8 + (long)(int)(local_1904 * local_18ac) * 2;
      } while (local_21dc < in_stack_00000008);
      src0_09[1] = local_37c0;
      src0_09[0] = uVar70;
      src0_09[2] = iStack_37b8;
      src0_09[3] = lStack_37b0;
      src1_09[0]._6_2_ = uVar68;
      src1_09[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_09[1] = auVar69._0_8_;
      src1_09[2] = auVar69._8_8_;
      src1_09[3] = auVar69._16_8_;
      iVar51 = local_22c0;
      iVar58 = iStack_22b8;
      iVar62 = iStack_22b0;
      iVar65 = iStack_22a8;
      hadd_four_32_to_64_avx2
                (src0_09,src1_09,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      local_dc8 = M + (long)(local_21c4 * 0x31) + (long)(local_1908 * 7);
      *local_dc8 = iVar51;
      local_dc8[1] = iVar58;
      local_dc8[2] = iVar62;
      local_dc8[3] = iVar65;
      src0_10[1] = local_37c0;
      src0_10[0] = uVar70;
      src0_10[2] = iStack_37b8;
      src0_10[3] = lStack_37b0;
      src1_10[0]._6_2_ = uVar68;
      src1_10[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_10[1] = auVar69._0_8_;
      src1_10[2] = auVar69._8_8_;
      src1_10[3] = auVar69._16_8_;
      iVar52 = local_2240;
      iVar59 = iStack_2238;
      iVar63 = iStack_2230;
      iVar66 = iStack_2228;
      local_2620 = iVar51;
      iStack_2618 = iVar58;
      iStack_2610 = iVar62;
      iStack_2608 = iVar65;
      local_e00 = iVar51;
      iStack_df8 = iVar58;
      iStack_df0 = iVar62;
      iStack_de8 = iVar65;
      hadd_four_32_to_64_avx2
                (src0_10,src1_10,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      lVar46 = (long)(local_21c4 * 0x31);
      lVar47 = (long)(local_1908 * 7);
      local_e08 = M + lVar46 + lVar47 + 4;
      *local_e08 = iVar52;
      M[lVar46 + lVar47 + 5] = iVar59;
      M[lVar46 + lVar47 + 6] = iVar63;
      M[lVar46 + lVar47 + 7] = iVar66;
      local_2640 = iVar52;
      iStack_2638 = iVar59;
      iStack_2630 = iVar63;
      iStack_2628 = iVar66;
      local_e40 = iVar52;
      iStack_e38 = iVar59;
      iStack_e30 = iVar63;
      iStack_e28 = iVar66;
    }
    local_21c4 = local_21c4 + 7;
  }
  local_2644 = 3;
  while( true ) {
    if (0x30 < local_2644) break;
    local_1908 = local_2644 / 7;
    local_2650 = local_18a8 + (long)local_1908 * 2;
    in_stack_ffffffffffffc5d0 = local_18a8 + (long)local_1908 * 2;
    local_2658 = in_stack_ffffffffffffc5d0 + (long)((local_2644 % 7) * local_18ac) * 2;
    local_265c = local_18c4;
    local_1904 = 1;
    if ((int)H != 0) {
      local_1904 = 4;
    }
    memset(&local_2740,0,0xe0);
    do {
      local_2744 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_265c < 4)) {
        local_1904 = in_stack_00000008 - local_265c;
      }
      local_114c = (ushort)local_1904;
      local_ac2 = (ushort)local_1904;
      local_ac4 = (ushort)local_1904;
      local_ac6 = (ushort)local_1904;
      local_ac8 = (ushort)local_1904;
      local_aca = (ushort)local_1904;
      local_acc = (ushort)local_1904;
      local_ace = (ushort)local_1904;
      local_ad0 = (ushort)local_1904;
      local_ad2 = (ushort)local_1904;
      local_ad4 = (ushort)local_1904;
      local_ad6 = (ushort)local_1904;
      local_ad8 = (ushort)local_1904;
      local_ada = (ushort)local_1904;
      local_adc = (ushort)local_1904;
      local_ade = (ushort)local_1904;
      local_ae0 = (ushort)local_1904;
      auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
      auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
      local_b00._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
      local_b00._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
      in_stack_ffffffffffffc5ce = (ushort)local_1904;
      local_2780 = local_b00._0_16_;
      auStack_2770 = local_b00._16_16_;
      while( true ) {
        if ((int)local_18d0 <= local_2744) break;
        local_15e0 = (undefined1 (*) [32])(local_2658 + (long)local_2744 * 2);
        local_27a0 = *(undefined8 *)*local_15e0;
        uStack_2798 = *(undefined8 *)(*local_15e0 + 8);
        uStack_2790 = *(undefined8 *)(*local_15e0 + 0x10);
        uStack_2788 = *(undefined8 *)(*local_15e0 + 0x18);
        auVar33._16_8_ = auStack_2770._0_8_;
        auVar33._0_16_ = local_2780;
        auVar33._24_8_ = auStack_2770._8_8_;
        local_27c0 = vpmullw_avx2(*local_15e0,auVar33);
        local_460 = local_27a0;
        uStack_458 = uStack_2798;
        uStack_450 = uStack_2790;
        uStack_448 = uStack_2788;
        local_480 = local_2780;
        auStack_470 = auStack_2770;
        for (local_27c4 = 0; local_27c4 < 4; local_27c4 = local_27c4 + 1) {
          local_15e8 = (undefined8 *)
                       (local_2650 + (long)local_2744 * 2 + (long)(local_18ac * 3) * 2 +
                       (long)(local_27c4 * local_18ac) * 2);
          local_2800 = *local_15e8;
          uStack_27f8 = local_15e8[1];
          uStack_27f0 = local_15e8[2];
          uStack_27e8 = local_15e8[3];
          src_13[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_13[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_13[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_13[1] = in_stack_ffffffffffffc5c0;
          src_13[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_13[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_13[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_13[3] = in_stack_ffffffffffffc5d0;
          dgd_40[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_40[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_40[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_40[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_40[1] = in_stack_ffffffffffffc5a0;
          dgd_40[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_40[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_40[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_40[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_13,dgd_40,in_stack_ffffffffffffc590);
        }
        local_2744 = local_2744 + 0x10;
      }
      if (local_18d4 != 0) {
        local_15f0 = (undefined1 (*) [32])(local_2658 + (long)local_2744 * 2);
        local_2820 = *(undefined8 *)*local_15f0;
        uStack_2818 = *(undefined8 *)(*local_15f0 + 8);
        uStack_2810 = *(undefined8 *)(*local_15f0 + 0x10);
        uStack_2808 = *(undefined8 *)(*local_15f0 + 0x18);
        local_1320 = local_1900;
        uStack_1318 = uStack_18f8;
        uStack_1310 = uStack_18f0;
        uStack_1308 = uStack_18e8;
        auVar10._8_8_ = uStack_18f8;
        auVar10._0_8_ = local_1900;
        auVar10._16_8_ = uStack_18f0;
        auVar10._24_8_ = uStack_18e8;
        local_2840 = vpand_avx2(*local_15f0,auVar10);
        local_4a0 = local_2840._0_8_;
        uStack_498 = local_2840._8_8_;
        uStack_490 = local_2840._16_8_;
        uStack_488 = local_2840._24_8_;
        auVar32._16_8_ = auStack_2770._0_8_;
        auVar32._0_16_ = local_2780;
        auVar32._24_8_ = auStack_2770._8_8_;
        local_2860 = vpmullw_avx2(local_2840,auVar32);
        local_1300 = local_2820;
        uStack_12f8 = uStack_2818;
        uStack_12f0 = uStack_2810;
        uStack_12e8 = uStack_2808;
        local_4c0 = local_2780;
        auStack_4b0 = auStack_2770;
        for (local_2864 = 0; local_2864 < 4; local_2864 = local_2864 + 1) {
          local_15f8 = (undefined8 *)
                       (local_2650 + (long)local_2744 * 2 + (long)(local_18ac * 3) * 2 +
                       (long)(local_2864 * local_18ac) * 2);
          local_28a0 = *local_15f8;
          uStack_2898 = local_15f8[1];
          uStack_2890 = local_15f8[2];
          uStack_2888 = local_15f8[3];
          src_14[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_14[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_14[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_14[1] = in_stack_ffffffffffffc5c0;
          src_14[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_14[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_14[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_14[3] = in_stack_ffffffffffffc5d0;
          dgd_41[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_41[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_41[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_41[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_41[1] = in_stack_ffffffffffffc5a0;
          dgd_41[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_41[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_41[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_41[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_14,dgd_41,in_stack_ffffffffffffc590);
        }
      }
      local_265c = local_1904 + local_265c;
      local_2650 = local_2650 + (long)(int)(local_1904 * local_18ac) * 2;
      local_2658 = local_2658 + (long)(int)(local_1904 * local_18ac) * 2;
    } while (local_265c < in_stack_00000008);
    src0_11[1] = local_37c0;
    src0_11[0] = uVar70;
    src0_11[2] = iStack_37b8;
    src0_11[3] = lStack_37b0;
    src1_11[0]._6_2_ = uVar68;
    src1_11[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_11[1] = auVar69._0_8_;
    src1_11[2] = auVar69._8_8_;
    src1_11[3] = auVar69._16_8_;
    iVar51 = local_2740;
    iVar58 = iStack_2738;
    iVar62 = iStack_2730;
    iVar65 = iStack_2728;
    hadd_four_32_to_64_avx2
              (src0_11,src1_11,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    local_e48 = M + (long)(local_2644 * 0x31) + (long)local_2644;
    *local_e48 = iVar51;
    local_e48[1] = iVar58;
    local_e48[2] = iVar62;
    local_e48[3] = iVar65;
    local_28c0 = iVar51;
    iStack_28b8 = iVar58;
    iStack_28b0 = iVar62;
    iStack_28a8 = iVar65;
    local_e80 = iVar51;
    iStack_e78 = iVar58;
    iStack_e70 = iVar62;
    iStack_e68 = iVar65;
    while (local_1908 = local_1908 + 1, local_1908 < 7) {
      local_2650 = local_18a8;
      local_2658 = local_18a8 + (long)(local_2644 / 7) * 2 +
                   (long)((local_2644 % 7) * local_18ac) * 2;
      local_1820 = 0;
      uStack_1818 = 0;
      uStack_1810 = 0;
      uStack_1808 = 0;
      local_28e0 = 0;
      uStack_28d8 = 0;
      uStack_28d0 = 0;
      uStack_28c8 = 0;
      local_2740 = 0;
      iStack_2738 = 0;
      iStack_2730 = 0;
      iStack_2728 = 0;
      local_2720 = 0;
      uStack_2718 = 0;
      uStack_2710 = 0;
      uStack_2708 = 0;
      local_2700 = 0;
      uStack_26f8 = 0;
      uStack_26f0 = 0;
      uStack_26e8 = 0;
      local_26e0 = 0;
      uStack_26d8 = 0;
      uStack_26d0 = 0;
      uStack_26c8 = 0;
      local_26c0 = 0;
      iStack_26b8 = 0;
      iStack_26b0 = 0;
      iStack_26a8 = 0;
      local_26a0 = 0;
      uStack_2698 = 0;
      uStack_2690 = 0;
      uStack_2688 = 0;
      local_2680 = 0;
      uStack_2678 = 0;
      uStack_2670 = 0;
      uStack_2668 = 0;
      local_265c = local_18c4;
      local_1904 = 1;
      if ((int)H != 0) {
        local_1904 = 4;
      }
      do {
        local_28e4 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_265c < 4)) {
          local_1904 = in_stack_00000008 - local_265c;
        }
        local_114e = (ushort)local_1904;
        local_a82 = (ushort)local_1904;
        local_a84 = (ushort)local_1904;
        local_a86 = (ushort)local_1904;
        local_a88 = (ushort)local_1904;
        local_a8a = (ushort)local_1904;
        local_a8c = (ushort)local_1904;
        local_a8e = (ushort)local_1904;
        local_a90 = (ushort)local_1904;
        local_a92 = (ushort)local_1904;
        local_a94 = (ushort)local_1904;
        local_a96 = (ushort)local_1904;
        local_a98 = (ushort)local_1904;
        local_a9a = (ushort)local_1904;
        local_a9c = (ushort)local_1904;
        local_a9e = (ushort)local_1904;
        local_aa0 = (ushort)local_1904;
        auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
        auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
        local_ac0._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
        local_ac0._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
        in_stack_ffffffffffffc5cc = (ushort)local_1904;
        local_2920 = local_ac0._0_16_;
        auStack_2910 = local_ac0._16_16_;
        while( true ) {
          if ((int)local_18d0 <= local_28e4) break;
          local_1600 = (undefined1 (*) [32])(local_2658 + (long)local_28e4 * 2);
          local_2940 = *(undefined8 *)*local_1600;
          uStack_2938 = *(undefined8 *)(*local_1600 + 8);
          uStack_2930 = *(undefined8 *)(*local_1600 + 0x10);
          uStack_2928 = *(undefined8 *)(*local_1600 + 0x18);
          auVar31._16_8_ = auStack_2910._0_8_;
          auVar31._0_16_ = local_2920;
          auVar31._24_8_ = auStack_2910._8_8_;
          local_2960 = vpmullw_avx2(*local_1600,auVar31);
          local_4e0 = local_2940;
          uStack_4d8 = uStack_2938;
          uStack_4d0 = uStack_2930;
          uStack_4c8 = uStack_2928;
          local_500 = local_2920;
          auStack_4f0 = auStack_2910;
          for (local_2964 = 0; local_2964 < 7; local_2964 = local_2964 + 1) {
            local_1608 = (undefined8 *)
                         (local_2650 + (long)local_1908 * 2 + (long)local_28e4 * 2 +
                         (long)(local_2964 * local_18ac) * 2);
            local_29a0 = *local_1608;
            uStack_2998 = local_1608[1];
            uStack_2990 = local_1608[2];
            uStack_2988 = local_1608[3];
            src_15[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_15[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_15[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_15[1] = in_stack_ffffffffffffc5c0;
            src_15[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_15[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_15[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_15[3] = in_stack_ffffffffffffc5d0;
            dgd_42[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_42[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_42[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_42[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_42[1] = in_stack_ffffffffffffc5a0;
            dgd_42[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_42[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_42[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_42[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_15,dgd_42,in_stack_ffffffffffffc590);
          }
          local_28e4 = local_28e4 + 0x10;
        }
        if (local_18d4 != 0) {
          local_1610 = (undefined1 (*) [32])(local_2658 + (long)local_28e4 * 2);
          local_29c0 = *(undefined8 *)*local_1610;
          uStack_29b8 = *(undefined8 *)(*local_1610 + 8);
          uStack_29b0 = *(undefined8 *)(*local_1610 + 0x10);
          uStack_29a8 = *(undefined8 *)(*local_1610 + 0x18);
          local_1360 = local_1900;
          uStack_1358 = uStack_18f8;
          uStack_1350 = uStack_18f0;
          uStack_1348 = uStack_18e8;
          auVar9._8_8_ = uStack_18f8;
          auVar9._0_8_ = local_1900;
          auVar9._16_8_ = uStack_18f0;
          auVar9._24_8_ = uStack_18e8;
          local_29e0 = vpand_avx2(*local_1610,auVar9);
          local_520 = local_29e0._0_8_;
          uStack_518 = local_29e0._8_8_;
          uStack_510 = local_29e0._16_8_;
          uStack_508 = local_29e0._24_8_;
          auVar30._16_8_ = auStack_2910._0_8_;
          auVar30._0_16_ = local_2920;
          auVar30._24_8_ = auStack_2910._8_8_;
          local_2a00 = vpmullw_avx2(local_29e0,auVar30);
          local_1340 = local_29c0;
          uStack_1338 = uStack_29b8;
          uStack_1330 = uStack_29b0;
          uStack_1328 = uStack_29a8;
          local_540 = local_2920;
          auStack_530 = auStack_2910;
          for (local_2a04 = 0; local_2a04 < 7; local_2a04 = local_2a04 + 1) {
            local_1618 = (undefined8 *)
                         (local_2650 + (long)local_1908 * 2 + (long)local_28e4 * 2 +
                         (long)(local_2a04 * local_18ac) * 2);
            local_2a40 = *local_1618;
            uStack_2a38 = local_1618[1];
            uStack_2a30 = local_1618[2];
            uStack_2a28 = local_1618[3];
            src_16[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_16[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_16[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_16[1] = in_stack_ffffffffffffc5c0;
            src_16[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_16[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_16[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_16[3] = in_stack_ffffffffffffc5d0;
            dgd_43[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_43[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_43[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_43[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_43[1] = in_stack_ffffffffffffc5a0;
            dgd_43[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_43[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_43[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_43[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_16,dgd_43,in_stack_ffffffffffffc590);
          }
        }
        local_265c = local_1904 + local_265c;
        local_2650 = local_2650 + (long)(int)(local_1904 * local_18ac) * 2;
        local_2658 = local_2658 + (long)(int)(local_1904 * local_18ac) * 2;
      } while (local_265c < in_stack_00000008);
      src0_12[1] = local_37c0;
      src0_12[0] = uVar70;
      src0_12[2] = iStack_37b8;
      src0_12[3] = lStack_37b0;
      src1_12[0]._6_2_ = uVar68;
      src1_12[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_12[1] = auVar69._0_8_;
      src1_12[2] = auVar69._8_8_;
      src1_12[3] = auVar69._16_8_;
      iVar51 = local_2740;
      iVar58 = iStack_2738;
      iVar62 = iStack_2730;
      iVar65 = iStack_2728;
      hadd_four_32_to_64_avx2
                (src0_12,src1_12,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      local_e88 = M + (long)(local_2644 * 0x31) + (long)(local_1908 * 7);
      *local_e88 = iVar51;
      local_e88[1] = iVar58;
      local_e88[2] = iVar62;
      local_e88[3] = iVar65;
      src0_13[1] = local_37c0;
      src0_13[0] = uVar70;
      src0_13[2] = iStack_37b8;
      src0_13[3] = lStack_37b0;
      src1_13[0]._6_2_ = uVar68;
      src1_13[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_13[1] = auVar69._0_8_;
      src1_13[2] = auVar69._8_8_;
      src1_13[3] = auVar69._16_8_;
      iVar52 = local_26c0;
      iVar59 = iStack_26b8;
      iVar63 = iStack_26b0;
      iVar66 = iStack_26a8;
      local_2a60 = iVar51;
      iStack_2a58 = iVar58;
      iStack_2a50 = iVar62;
      iStack_2a48 = iVar65;
      local_ec0 = iVar51;
      iStack_eb8 = iVar58;
      iStack_eb0 = iVar62;
      iStack_ea8 = iVar65;
      hadd_four_32_to_64_avx2
                (src0_13,src1_13,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      lVar46 = (long)(local_2644 * 0x31);
      lVar47 = (long)(local_1908 * 7);
      local_ec8 = M + lVar46 + lVar47 + 4;
      *local_ec8 = iVar52;
      M[lVar46 + lVar47 + 5] = iVar59;
      M[lVar46 + lVar47 + 6] = iVar63;
      M[lVar46 + lVar47 + 7] = iVar66;
      local_2a80 = iVar52;
      iStack_2a78 = iVar59;
      iStack_2a70 = iVar63;
      iStack_2a68 = iVar66;
      local_f00 = iVar52;
      iStack_ef8 = iVar59;
      iStack_ef0 = iVar63;
      iStack_ee8 = iVar66;
    }
    local_2644 = local_2644 + 7;
  }
  local_2a84 = 4;
  while( true ) {
    if (0x30 < local_2a84) break;
    local_1908 = local_2a84 / 7;
    local_2a90 = local_18a8 + (long)local_1908 * 2;
    in_stack_ffffffffffffc5c0 = local_18a8 + (long)local_1908 * 2;
    local_2a98 = in_stack_ffffffffffffc5c0 + (long)((local_2a84 % 7) * local_18ac) * 2;
    local_2a9c = local_18c4;
    local_1904 = 1;
    if ((int)H != 0) {
      local_1904 = 4;
    }
    memset(&local_2b80,0,0xe0);
    do {
      local_2b84 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_2a9c < 4)) {
        local_1904 = in_stack_00000008 - local_2a9c;
      }
      local_1150 = (ushort)local_1904;
      local_a42 = (ushort)local_1904;
      local_a44 = (ushort)local_1904;
      local_a46 = (ushort)local_1904;
      local_a48 = (ushort)local_1904;
      local_a4a = (ushort)local_1904;
      local_a4c = (ushort)local_1904;
      local_a4e = (ushort)local_1904;
      local_a50 = (ushort)local_1904;
      local_a52 = (ushort)local_1904;
      local_a54 = (ushort)local_1904;
      local_a56 = (ushort)local_1904;
      local_a58 = (ushort)local_1904;
      local_a5a = (ushort)local_1904;
      local_a5c = (ushort)local_1904;
      local_a5e = (ushort)local_1904;
      local_a60 = (ushort)local_1904;
      auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
      auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
      local_a80._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
      local_a80._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
      in_stack_ffffffffffffc5be = (ushort)local_1904;
      local_2bc0 = local_a80._0_16_;
      auStack_2bb0 = local_a80._16_16_;
      while( true ) {
        if ((int)local_18d0 <= local_2b84) break;
        local_1620 = (undefined1 (*) [32])(local_2a98 + (long)local_2b84 * 2);
        local_2be0 = *(undefined8 *)*local_1620;
        uStack_2bd8 = *(undefined8 *)(*local_1620 + 8);
        uStack_2bd0 = *(undefined8 *)(*local_1620 + 0x10);
        uStack_2bc8 = *(undefined8 *)(*local_1620 + 0x18);
        auVar29._16_8_ = auStack_2bb0._0_8_;
        auVar29._0_16_ = local_2bc0;
        auVar29._24_8_ = auStack_2bb0._8_8_;
        local_2c00 = vpmullw_avx2(*local_1620,auVar29);
        local_560 = local_2be0;
        uStack_558 = uStack_2bd8;
        uStack_550 = uStack_2bd0;
        uStack_548 = uStack_2bc8;
        local_580 = local_2bc0;
        auStack_570 = auStack_2bb0;
        for (local_2c04 = 0; local_2c04 < 3; local_2c04 = local_2c04 + 1) {
          local_1628 = (undefined8 *)
                       (local_2a90 + (long)local_2b84 * 2 + (long)(local_18ac << 2) * 2 +
                       (long)(local_2c04 * local_18ac) * 2);
          local_2c40 = *local_1628;
          uStack_2c38 = local_1628[1];
          uStack_2c30 = local_1628[2];
          uStack_2c28 = local_1628[3];
          src_17[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_17[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_17[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_17[1] = in_stack_ffffffffffffc5c0;
          src_17[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_17[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_17[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_17[3] = in_stack_ffffffffffffc5d0;
          dgd_44[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_44[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_44[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_44[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_44[1] = in_stack_ffffffffffffc5a0;
          dgd_44[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_44[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_44[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_44[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_17,dgd_44,in_stack_ffffffffffffc590);
        }
        local_2b84 = local_2b84 + 0x10;
      }
      if (local_18d4 != 0) {
        local_1630 = (undefined1 (*) [32])(local_2a98 + (long)local_2b84 * 2);
        local_2c60 = *(undefined8 *)*local_1630;
        uStack_2c58 = *(undefined8 *)(*local_1630 + 8);
        uStack_2c50 = *(undefined8 *)(*local_1630 + 0x10);
        uStack_2c48 = *(undefined8 *)(*local_1630 + 0x18);
        local_13a0 = local_1900;
        uStack_1398 = uStack_18f8;
        uStack_1390 = uStack_18f0;
        uStack_1388 = uStack_18e8;
        auVar8._8_8_ = uStack_18f8;
        auVar8._0_8_ = local_1900;
        auVar8._16_8_ = uStack_18f0;
        auVar8._24_8_ = uStack_18e8;
        local_2c80 = vpand_avx2(*local_1630,auVar8);
        local_5a0 = local_2c80._0_8_;
        uStack_598 = local_2c80._8_8_;
        uStack_590 = local_2c80._16_8_;
        uStack_588 = local_2c80._24_8_;
        auVar28._16_8_ = auStack_2bb0._0_8_;
        auVar28._0_16_ = local_2bc0;
        auVar28._24_8_ = auStack_2bb0._8_8_;
        local_2ca0 = vpmullw_avx2(local_2c80,auVar28);
        local_1380 = local_2c60;
        uStack_1378 = uStack_2c58;
        uStack_1370 = uStack_2c50;
        uStack_1368 = uStack_2c48;
        local_5c0 = local_2bc0;
        auStack_5b0 = auStack_2bb0;
        for (local_2ca4 = 0; local_2ca4 < 3; local_2ca4 = local_2ca4 + 1) {
          local_1638 = (undefined8 *)
                       (local_2a90 + (long)local_2b84 * 2 + (long)(local_18ac << 2) * 2 +
                       (long)(local_2ca4 * local_18ac) * 2);
          local_2ce0 = *local_1638;
          uStack_2cd8 = local_1638[1];
          uStack_2cd0 = local_1638[2];
          uStack_2cc8 = local_1638[3];
          src_18[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_18[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_18[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_18[1] = in_stack_ffffffffffffc5c0;
          src_18[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_18[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_18[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_18[3] = in_stack_ffffffffffffc5d0;
          dgd_45[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_45[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_45[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_45[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_45[1] = in_stack_ffffffffffffc5a0;
          dgd_45[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_45[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_45[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_45[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_18,dgd_45,in_stack_ffffffffffffc590);
        }
      }
      local_2a9c = local_1904 + local_2a9c;
      local_2a90 = local_2a90 + (long)(int)(local_1904 * local_18ac) * 2;
      local_2a98 = local_2a98 + (long)(int)(local_1904 * local_18ac) * 2;
    } while (local_2a9c < in_stack_00000008);
    src0_14[1] = local_37c0;
    src0_14[0] = uVar70;
    src0_14[2] = iStack_37b8;
    src0_14[3] = lStack_37b0;
    src1_14[0]._6_2_ = uVar68;
    src1_14[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_14[1] = auVar69._0_8_;
    src1_14[2] = auVar69._8_8_;
    src1_14[3] = auVar69._16_8_;
    iVar51 = local_2b80;
    iVar58 = iStack_2b78;
    iVar62 = iStack_2b70;
    iVar65 = iStack_2b68;
    hadd_four_32_to_64_avx2
              (src0_14,src1_14,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    local_f08 = M + (long)(local_2a84 * 0x31) + (long)local_2a84;
    *local_f08 = iVar51;
    local_f08[1] = iVar58;
    local_f08[2] = iVar62;
    local_f08[3] = iVar65;
    local_2d00 = iVar51;
    iStack_2cf8 = iVar58;
    iStack_2cf0 = iVar62;
    iStack_2ce8 = iVar65;
    local_f40 = iVar51;
    iStack_f38 = iVar58;
    iStack_f30 = iVar62;
    iStack_f28 = iVar65;
    while (local_1908 = local_1908 + 1, local_1908 < 7) {
      local_2a90 = local_18a8;
      local_2a98 = local_18a8 + (long)(local_2a84 / 7) * 2 +
                   (long)((local_2a84 % 7) * local_18ac) * 2;
      local_1840 = 0;
      uStack_1838 = 0;
      uStack_1830 = 0;
      uStack_1828 = 0;
      local_2d20 = 0;
      uStack_2d18 = 0;
      uStack_2d10 = 0;
      uStack_2d08 = 0;
      local_2b80 = 0;
      iStack_2b78 = 0;
      iStack_2b70 = 0;
      iStack_2b68 = 0;
      local_2b60 = 0;
      uStack_2b58 = 0;
      uStack_2b50 = 0;
      uStack_2b48 = 0;
      local_2b40 = 0;
      uStack_2b38 = 0;
      uStack_2b30 = 0;
      uStack_2b28 = 0;
      local_2b20 = 0;
      uStack_2b18 = 0;
      uStack_2b10 = 0;
      uStack_2b08 = 0;
      local_2b00 = 0;
      iStack_2af8 = 0;
      iStack_2af0 = 0;
      iStack_2ae8 = 0;
      local_2ae0 = 0;
      uStack_2ad8 = 0;
      uStack_2ad0 = 0;
      uStack_2ac8 = 0;
      local_2ac0 = 0;
      uStack_2ab8 = 0;
      uStack_2ab0 = 0;
      uStack_2aa8 = 0;
      local_2a9c = local_18c4;
      local_1904 = 1;
      if ((int)H != 0) {
        local_1904 = 4;
      }
      do {
        local_2d24 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_2a9c < 4)) {
          local_1904 = in_stack_00000008 - local_2a9c;
        }
        local_1152 = (ushort)local_1904;
        local_a02 = (ushort)local_1904;
        local_a04 = (ushort)local_1904;
        local_a06 = (ushort)local_1904;
        local_a08 = (ushort)local_1904;
        local_a0a = (ushort)local_1904;
        local_a0c = (ushort)local_1904;
        local_a0e = (ushort)local_1904;
        local_a10 = (ushort)local_1904;
        local_a12 = (ushort)local_1904;
        local_a14 = (ushort)local_1904;
        local_a16 = (ushort)local_1904;
        local_a18 = (ushort)local_1904;
        local_a1a = (ushort)local_1904;
        local_a1c = (ushort)local_1904;
        local_a1e = (ushort)local_1904;
        local_a20 = (ushort)local_1904;
        auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
        auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
        local_a40._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
        local_a40._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
        in_stack_ffffffffffffc5bc = (ushort)local_1904;
        local_2d60 = local_a40._0_16_;
        auStack_2d50 = local_a40._16_16_;
        while( true ) {
          if ((int)local_18d0 <= local_2d24) break;
          local_1640 = (undefined1 (*) [32])(local_2a98 + (long)local_2d24 * 2);
          local_2d80 = *(undefined8 *)*local_1640;
          uStack_2d78 = *(undefined8 *)(*local_1640 + 8);
          uStack_2d70 = *(undefined8 *)(*local_1640 + 0x10);
          uStack_2d68 = *(undefined8 *)(*local_1640 + 0x18);
          auVar27._16_8_ = auStack_2d50._0_8_;
          auVar27._0_16_ = local_2d60;
          auVar27._24_8_ = auStack_2d50._8_8_;
          local_2da0 = vpmullw_avx2(*local_1640,auVar27);
          local_5e0 = local_2d80;
          uStack_5d8 = uStack_2d78;
          uStack_5d0 = uStack_2d70;
          uStack_5c8 = uStack_2d68;
          local_600 = local_2d60;
          auStack_5f0 = auStack_2d50;
          for (local_2da4 = 0; local_2da4 < 7; local_2da4 = local_2da4 + 1) {
            local_1648 = (undefined8 *)
                         (local_2a90 + (long)local_1908 * 2 + (long)local_2d24 * 2 +
                         (long)(local_2da4 * local_18ac) * 2);
            local_2de0 = *local_1648;
            uStack_2dd8 = local_1648[1];
            uStack_2dd0 = local_1648[2];
            uStack_2dc8 = local_1648[3];
            src_19[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_19[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_19[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_19[1] = in_stack_ffffffffffffc5c0;
            src_19[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_19[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_19[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_19[3] = in_stack_ffffffffffffc5d0;
            dgd_46[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_46[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_46[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_46[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_46[1] = in_stack_ffffffffffffc5a0;
            dgd_46[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_46[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_46[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_46[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_19,dgd_46,in_stack_ffffffffffffc590);
          }
          local_2d24 = local_2d24 + 0x10;
        }
        if (local_18d4 != 0) {
          local_1650 = (undefined1 (*) [32])(local_2a98 + (long)local_2d24 * 2);
          local_2e00 = *(undefined8 *)*local_1650;
          uStack_2df8 = *(undefined8 *)(*local_1650 + 8);
          uStack_2df0 = *(undefined8 *)(*local_1650 + 0x10);
          uStack_2de8 = *(undefined8 *)(*local_1650 + 0x18);
          local_13e0 = local_1900;
          uStack_13d8 = uStack_18f8;
          uStack_13d0 = uStack_18f0;
          uStack_13c8 = uStack_18e8;
          auVar7._8_8_ = uStack_18f8;
          auVar7._0_8_ = local_1900;
          auVar7._16_8_ = uStack_18f0;
          auVar7._24_8_ = uStack_18e8;
          local_2e20 = vpand_avx2(*local_1650,auVar7);
          local_620 = local_2e20._0_8_;
          uStack_618 = local_2e20._8_8_;
          uStack_610 = local_2e20._16_8_;
          uStack_608 = local_2e20._24_8_;
          auVar26._16_8_ = auStack_2d50._0_8_;
          auVar26._0_16_ = local_2d60;
          auVar26._24_8_ = auStack_2d50._8_8_;
          local_2e40 = vpmullw_avx2(local_2e20,auVar26);
          local_13c0 = local_2e00;
          uStack_13b8 = uStack_2df8;
          uStack_13b0 = uStack_2df0;
          uStack_13a8 = uStack_2de8;
          local_640 = local_2d60;
          auStack_630 = auStack_2d50;
          for (local_2e44 = 0; local_2e44 < 7; local_2e44 = local_2e44 + 1) {
            local_1658 = (undefined8 *)
                         (local_2a90 + (long)local_1908 * 2 + (long)local_2d24 * 2 +
                         (long)(local_2e44 * local_18ac) * 2);
            local_2e80 = *local_1658;
            uStack_2e78 = local_1658[1];
            uStack_2e70 = local_1658[2];
            uStack_2e68 = local_1658[3];
            src_20[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_20[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_20[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_20[1] = in_stack_ffffffffffffc5c0;
            src_20[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_20[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_20[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_20[3] = in_stack_ffffffffffffc5d0;
            dgd_47[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_47[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_47[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_47[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_47[1] = in_stack_ffffffffffffc5a0;
            dgd_47[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_47[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_47[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_47[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_20,dgd_47,in_stack_ffffffffffffc590);
          }
        }
        local_2a9c = local_1904 + local_2a9c;
        local_2a90 = local_2a90 + (long)(int)(local_1904 * local_18ac) * 2;
        local_2a98 = local_2a98 + (long)(int)(local_1904 * local_18ac) * 2;
      } while (local_2a9c < in_stack_00000008);
      src0_15[1] = local_37c0;
      src0_15[0] = uVar70;
      src0_15[2] = iStack_37b8;
      src0_15[3] = lStack_37b0;
      src1_15[0]._6_2_ = uVar68;
      src1_15[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_15[1] = auVar69._0_8_;
      src1_15[2] = auVar69._8_8_;
      src1_15[3] = auVar69._16_8_;
      iVar51 = local_2b80;
      iVar58 = iStack_2b78;
      iVar62 = iStack_2b70;
      iVar65 = iStack_2b68;
      hadd_four_32_to_64_avx2
                (src0_15,src1_15,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      local_f48 = M + (long)(local_2a84 * 0x31) + (long)(local_1908 * 7);
      *local_f48 = iVar51;
      local_f48[1] = iVar58;
      local_f48[2] = iVar62;
      local_f48[3] = iVar65;
      src0_16[1] = local_37c0;
      src0_16[0] = uVar70;
      src0_16[2] = iStack_37b8;
      src0_16[3] = lStack_37b0;
      src1_16[0]._6_2_ = uVar68;
      src1_16[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_16[1] = auVar69._0_8_;
      src1_16[2] = auVar69._8_8_;
      src1_16[3] = auVar69._16_8_;
      iVar52 = local_2b00;
      iVar59 = iStack_2af8;
      iVar63 = iStack_2af0;
      iVar66 = iStack_2ae8;
      local_2ea0 = iVar51;
      iStack_2e98 = iVar58;
      iStack_2e90 = iVar62;
      iStack_2e88 = iVar65;
      local_f80 = iVar51;
      iStack_f78 = iVar58;
      iStack_f70 = iVar62;
      iStack_f68 = iVar65;
      hadd_four_32_to_64_avx2
                (src0_16,src1_16,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      lVar46 = (long)(local_2a84 * 0x31);
      lVar47 = (long)(local_1908 * 7);
      local_f88 = M + lVar46 + lVar47 + 4;
      *local_f88 = iVar52;
      M[lVar46 + lVar47 + 5] = iVar59;
      M[lVar46 + lVar47 + 6] = iVar63;
      M[lVar46 + lVar47 + 7] = iVar66;
      local_2ec0 = iVar52;
      iStack_2eb8 = iVar59;
      iStack_2eb0 = iVar63;
      iStack_2ea8 = iVar66;
      local_fc0 = iVar52;
      iStack_fb8 = iVar59;
      iStack_fb0 = iVar63;
      iStack_fa8 = iVar66;
    }
    local_2a84 = local_2a84 + 7;
  }
  local_2ec4 = 5;
  while( true ) {
    if (0x30 < local_2ec4) break;
    local_1908 = local_2ec4 / 7;
    local_2ed0 = local_18a8 + (long)local_1908 * 2;
    in_stack_ffffffffffffc5b0 = local_18a8 + (long)local_1908 * 2;
    local_2ed8 = in_stack_ffffffffffffc5b0 + (long)((local_2ec4 % 7) * local_18ac) * 2;
    local_2edc = local_18c4;
    local_1904 = 1;
    if ((int)H != 0) {
      local_1904 = 4;
    }
    memset(&local_2fc0,0,0xe0);
    do {
      local_2fc4 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_2edc < 4)) {
        local_1904 = in_stack_00000008 - local_2edc;
      }
      local_1154 = (ushort)local_1904;
      local_9c2 = (ushort)local_1904;
      local_9c4 = (ushort)local_1904;
      local_9c6 = (ushort)local_1904;
      local_9c8 = (ushort)local_1904;
      local_9ca = (ushort)local_1904;
      local_9cc = (ushort)local_1904;
      local_9ce = (ushort)local_1904;
      local_9d0 = (ushort)local_1904;
      local_9d2 = (ushort)local_1904;
      local_9d4 = (ushort)local_1904;
      local_9d6 = (ushort)local_1904;
      local_9d8 = (ushort)local_1904;
      local_9da = (ushort)local_1904;
      local_9dc = (ushort)local_1904;
      local_9de = (ushort)local_1904;
      local_9e0 = (ushort)local_1904;
      auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
      auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
      local_a00._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
      local_a00._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
      in_stack_ffffffffffffc5ae = (ushort)local_1904;
      local_3000 = local_a00._0_16_;
      auStack_2ff0 = local_a00._16_16_;
      while( true ) {
        if ((int)local_18d0 <= local_2fc4) break;
        local_1660 = (undefined1 (*) [32])(local_2ed8 + (long)local_2fc4 * 2);
        local_3020 = *(undefined8 *)*local_1660;
        uStack_3018 = *(undefined8 *)(*local_1660 + 8);
        uStack_3010 = *(undefined8 *)(*local_1660 + 0x10);
        uStack_3008 = *(undefined8 *)(*local_1660 + 0x18);
        auVar25._16_8_ = auStack_2ff0._0_8_;
        auVar25._0_16_ = local_3000;
        auVar25._24_8_ = auStack_2ff0._8_8_;
        local_3040 = vpmullw_avx2(*local_1660,auVar25);
        local_660 = local_3020;
        uStack_658 = uStack_3018;
        uStack_650 = uStack_3010;
        uStack_648 = uStack_3008;
        local_680 = local_3000;
        auStack_670 = auStack_2ff0;
        for (local_3044 = 0; local_3044 < 2; local_3044 = local_3044 + 1) {
          local_1668 = (undefined8 *)
                       (local_2ed0 + (long)local_2fc4 * 2 + (long)(local_18ac * 5) * 2 +
                       (long)(local_3044 * local_18ac) * 2);
          local_3080 = *local_1668;
          uStack_3078 = local_1668[1];
          uStack_3070 = local_1668[2];
          uStack_3068 = local_1668[3];
          src_21[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_21[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_21[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_21[1] = in_stack_ffffffffffffc5c0;
          src_21[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_21[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_21[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_21[3] = in_stack_ffffffffffffc5d0;
          dgd_48[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_48[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_48[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_48[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_48[1] = in_stack_ffffffffffffc5a0;
          dgd_48[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_48[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_48[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_48[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_21,dgd_48,in_stack_ffffffffffffc590);
        }
        local_2fc4 = local_2fc4 + 0x10;
      }
      if (local_18d4 != 0) {
        local_1670 = (undefined1 (*) [32])(local_2ed8 + (long)local_2fc4 * 2);
        local_30a0 = *(undefined8 *)*local_1670;
        uStack_3098 = *(undefined8 *)(*local_1670 + 8);
        uStack_3090 = *(undefined8 *)(*local_1670 + 0x10);
        uStack_3088 = *(undefined8 *)(*local_1670 + 0x18);
        local_1420 = local_1900;
        uStack_1418 = uStack_18f8;
        uStack_1410 = uStack_18f0;
        uStack_1408 = uStack_18e8;
        auVar6._8_8_ = uStack_18f8;
        auVar6._0_8_ = local_1900;
        auVar6._16_8_ = uStack_18f0;
        auVar6._24_8_ = uStack_18e8;
        local_30c0 = vpand_avx2(*local_1670,auVar6);
        local_6a0 = local_30c0._0_8_;
        uStack_698 = local_30c0._8_8_;
        uStack_690 = local_30c0._16_8_;
        uStack_688 = local_30c0._24_8_;
        auVar24._16_8_ = auStack_2ff0._0_8_;
        auVar24._0_16_ = local_3000;
        auVar24._24_8_ = auStack_2ff0._8_8_;
        local_30e0 = vpmullw_avx2(local_30c0,auVar24);
        local_1400 = local_30a0;
        uStack_13f8 = uStack_3098;
        uStack_13f0 = uStack_3090;
        uStack_13e8 = uStack_3088;
        local_6c0 = local_3000;
        auStack_6b0 = auStack_2ff0;
        for (local_30e4 = 0; local_30e4 < 2; local_30e4 = local_30e4 + 1) {
          local_1678 = (undefined8 *)
                       (local_2ed0 + (long)local_2fc4 * 2 + (long)(local_18ac * 5) * 2 +
                       (long)(local_30e4 * local_18ac) * 2);
          local_3120 = *local_1678;
          uStack_3118 = local_1678[1];
          uStack_3110 = local_1678[2];
          uStack_3108 = local_1678[3];
          src_22[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_22[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_22[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_22[1] = in_stack_ffffffffffffc5c0;
          src_22[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_22[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_22[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_22[3] = in_stack_ffffffffffffc5d0;
          dgd_49[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_49[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_49[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_49[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_49[1] = in_stack_ffffffffffffc5a0;
          dgd_49[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_49[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_49[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_49[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_22,dgd_49,in_stack_ffffffffffffc590);
        }
      }
      local_2edc = local_1904 + local_2edc;
      local_2ed0 = local_2ed0 + (long)(int)(local_1904 * local_18ac) * 2;
      local_2ed8 = local_2ed8 + (long)(int)(local_1904 * local_18ac) * 2;
    } while (local_2edc < in_stack_00000008);
    src0_17[1] = local_37c0;
    src0_17[0] = uVar70;
    src0_17[2] = iStack_37b8;
    src0_17[3] = lStack_37b0;
    src1_17[0]._6_2_ = uVar68;
    src1_17[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_17[1] = auVar69._0_8_;
    src1_17[2] = auVar69._8_8_;
    src1_17[3] = auVar69._16_8_;
    iVar51 = local_2fc0;
    iVar58 = iStack_2fb8;
    iVar62 = iStack_2fb0;
    iVar65 = iStack_2fa8;
    hadd_four_32_to_64_avx2
              (src0_17,src1_17,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    local_fc8 = M + (long)(local_2ec4 * 0x31) + (long)local_2ec4;
    *local_fc8 = iVar51;
    local_fc8[1] = iVar58;
    local_fc8[2] = iVar62;
    local_fc8[3] = iVar65;
    local_3140 = iVar51;
    iStack_3138 = iVar58;
    iStack_3130 = iVar62;
    iStack_3128 = iVar65;
    local_1000 = iVar51;
    iStack_ff8 = iVar58;
    iStack_ff0 = iVar62;
    iStack_fe8 = iVar65;
    while (local_1908 = local_1908 + 1, local_1908 < 7) {
      local_2ed0 = local_18a8;
      local_2ed8 = local_18a8 + (long)(local_2ec4 / 7) * 2 +
                   (long)((local_2ec4 % 7) * local_18ac) * 2;
      local_1860 = 0;
      uStack_1858 = 0;
      uStack_1850 = 0;
      uStack_1848 = 0;
      local_3160 = 0;
      uStack_3158 = 0;
      uStack_3150 = 0;
      uStack_3148 = 0;
      local_2fc0 = 0;
      iStack_2fb8 = 0;
      iStack_2fb0 = 0;
      iStack_2fa8 = 0;
      local_2fa0 = 0;
      uStack_2f98 = 0;
      uStack_2f90 = 0;
      uStack_2f88 = 0;
      local_2f80 = 0;
      uStack_2f78 = 0;
      uStack_2f70 = 0;
      uStack_2f68 = 0;
      local_2f60 = 0;
      uStack_2f58 = 0;
      uStack_2f50 = 0;
      uStack_2f48 = 0;
      local_2f40 = 0;
      iStack_2f38 = 0;
      iStack_2f30 = 0;
      iStack_2f28 = 0;
      local_2f20 = 0;
      uStack_2f18 = 0;
      uStack_2f10 = 0;
      uStack_2f08 = 0;
      local_2f00 = 0;
      uStack_2ef8 = 0;
      uStack_2ef0 = 0;
      uStack_2ee8 = 0;
      local_2edc = local_18c4;
      local_1904 = 1;
      if ((int)H != 0) {
        local_1904 = 4;
      }
      do {
        local_3164 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_2edc < 4)) {
          local_1904 = in_stack_00000008 - local_2edc;
        }
        local_1156 = (ushort)local_1904;
        local_982 = (ushort)local_1904;
        local_984 = (ushort)local_1904;
        local_986 = (ushort)local_1904;
        local_988 = (ushort)local_1904;
        local_98a = (ushort)local_1904;
        local_98c = (ushort)local_1904;
        local_98e = (ushort)local_1904;
        local_990 = (ushort)local_1904;
        local_992 = (ushort)local_1904;
        local_994 = (ushort)local_1904;
        local_996 = (ushort)local_1904;
        local_998 = (ushort)local_1904;
        local_99a = (ushort)local_1904;
        local_99c = (ushort)local_1904;
        local_99e = (ushort)local_1904;
        local_9a0 = (ushort)local_1904;
        auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
        auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
        local_9c0._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
        local_9c0._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
        in_stack_ffffffffffffc5ac = (ushort)local_1904;
        local_31a0 = local_9c0._0_16_;
        auStack_3190 = local_9c0._16_16_;
        while( true ) {
          if ((int)local_18d0 <= local_3164) break;
          local_1680 = (undefined1 (*) [32])(local_2ed8 + (long)local_3164 * 2);
          local_31c0 = *(undefined8 *)*local_1680;
          uStack_31b8 = *(undefined8 *)(*local_1680 + 8);
          uStack_31b0 = *(undefined8 *)(*local_1680 + 0x10);
          uStack_31a8 = *(undefined8 *)(*local_1680 + 0x18);
          auVar23._16_8_ = auStack_3190._0_8_;
          auVar23._0_16_ = local_31a0;
          auVar23._24_8_ = auStack_3190._8_8_;
          local_31e0 = vpmullw_avx2(*local_1680,auVar23);
          local_6e0 = local_31c0;
          uStack_6d8 = uStack_31b8;
          uStack_6d0 = uStack_31b0;
          uStack_6c8 = uStack_31a8;
          local_700 = local_31a0;
          auStack_6f0 = auStack_3190;
          for (local_31e4 = 0; local_31e4 < 7; local_31e4 = local_31e4 + 1) {
            local_1688 = (undefined8 *)
                         (local_2ed0 + (long)local_1908 * 2 + (long)local_3164 * 2 +
                         (long)(local_31e4 * local_18ac) * 2);
            local_3220 = *local_1688;
            uStack_3218 = local_1688[1];
            uStack_3210 = local_1688[2];
            uStack_3208 = local_1688[3];
            src_23[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_23[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_23[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_23[1] = in_stack_ffffffffffffc5c0;
            src_23[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_23[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_23[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_23[3] = in_stack_ffffffffffffc5d0;
            dgd_50[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_50[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_50[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_50[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_50[1] = in_stack_ffffffffffffc5a0;
            dgd_50[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_50[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_50[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_50[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_23,dgd_50,in_stack_ffffffffffffc590);
          }
          local_3164 = local_3164 + 0x10;
        }
        if (local_18d4 != 0) {
          local_1690 = (undefined1 (*) [32])(local_2ed8 + (long)local_3164 * 2);
          local_3240 = *(undefined8 *)*local_1690;
          uStack_3238 = *(undefined8 *)(*local_1690 + 8);
          uStack_3230 = *(undefined8 *)(*local_1690 + 0x10);
          uStack_3228 = *(undefined8 *)(*local_1690 + 0x18);
          local_1460 = local_1900;
          uStack_1458 = uStack_18f8;
          uStack_1450 = uStack_18f0;
          uStack_1448 = uStack_18e8;
          auVar5._8_8_ = uStack_18f8;
          auVar5._0_8_ = local_1900;
          auVar5._16_8_ = uStack_18f0;
          auVar5._24_8_ = uStack_18e8;
          local_3260 = vpand_avx2(*local_1690,auVar5);
          local_720 = local_3260._0_8_;
          uStack_718 = local_3260._8_8_;
          uStack_710 = local_3260._16_8_;
          uStack_708 = local_3260._24_8_;
          auVar22._16_8_ = auStack_3190._0_8_;
          auVar22._0_16_ = local_31a0;
          auVar22._24_8_ = auStack_3190._8_8_;
          local_3280 = vpmullw_avx2(local_3260,auVar22);
          local_1440 = local_3240;
          uStack_1438 = uStack_3238;
          uStack_1430 = uStack_3230;
          uStack_1428 = uStack_3228;
          local_740 = local_31a0;
          auStack_730 = auStack_3190;
          for (local_3284 = 0; local_3284 < 7; local_3284 = local_3284 + 1) {
            local_1698 = (undefined8 *)
                         (local_2ed0 + (long)local_1908 * 2 + (long)local_3164 * 2 +
                         (long)(local_3284 * local_18ac) * 2);
            local_32c0 = *local_1698;
            uStack_32b8 = local_1698[1];
            uStack_32b0 = local_1698[2];
            uStack_32a8 = local_1698[3];
            src_24[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_24[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_24[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_24[1] = in_stack_ffffffffffffc5c0;
            src_24[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_24[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_24[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_24[3] = in_stack_ffffffffffffc5d0;
            dgd_51[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_51[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_51[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_51[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_51[1] = in_stack_ffffffffffffc5a0;
            dgd_51[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_51[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_51[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_51[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_24,dgd_51,in_stack_ffffffffffffc590);
          }
        }
        local_2edc = local_1904 + local_2edc;
        local_2ed0 = local_2ed0 + (long)(int)(local_1904 * local_18ac) * 2;
        local_2ed8 = local_2ed8 + (long)(int)(local_1904 * local_18ac) * 2;
      } while (local_2edc < in_stack_00000008);
      src0_18[1] = local_37c0;
      src0_18[0] = uVar70;
      src0_18[2] = iStack_37b8;
      src0_18[3] = lStack_37b0;
      src1_18[0]._6_2_ = uVar68;
      src1_18[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_18[1] = auVar69._0_8_;
      src1_18[2] = auVar69._8_8_;
      src1_18[3] = auVar69._16_8_;
      iVar51 = local_2fc0;
      iVar58 = iStack_2fb8;
      iVar62 = iStack_2fb0;
      iVar65 = iStack_2fa8;
      hadd_four_32_to_64_avx2
                (src0_18,src1_18,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      local_1008 = M + (long)(local_2ec4 * 0x31) + (long)(local_1908 * 7);
      *local_1008 = iVar51;
      local_1008[1] = iVar58;
      local_1008[2] = iVar62;
      local_1008[3] = iVar65;
      src0_19[1] = local_37c0;
      src0_19[0] = uVar70;
      src0_19[2] = iStack_37b8;
      src0_19[3] = lStack_37b0;
      src1_19[0]._6_2_ = uVar68;
      src1_19[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_19[1] = auVar69._0_8_;
      src1_19[2] = auVar69._8_8_;
      src1_19[3] = auVar69._16_8_;
      iVar52 = local_2f40;
      iVar59 = iStack_2f38;
      iVar63 = iStack_2f30;
      iVar66 = iStack_2f28;
      local_32e0 = iVar51;
      iStack_32d8 = iVar58;
      iStack_32d0 = iVar62;
      iStack_32c8 = iVar65;
      local_1040 = iVar51;
      iStack_1038 = iVar58;
      iStack_1030 = iVar62;
      iStack_1028 = iVar65;
      hadd_four_32_to_64_avx2
                (src0_19,src1_19,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      lVar46 = (long)(local_2ec4 * 0x31);
      lVar47 = (long)(local_1908 * 7);
      local_1048 = M + lVar46 + lVar47 + 4;
      *local_1048 = iVar52;
      M[lVar46 + lVar47 + 5] = iVar59;
      M[lVar46 + lVar47 + 6] = iVar63;
      M[lVar46 + lVar47 + 7] = iVar66;
      local_3300 = iVar52;
      iStack_32f8 = iVar59;
      iStack_32f0 = iVar63;
      iStack_32e8 = iVar66;
      local_1080 = iVar52;
      iStack_1078 = iVar59;
      iStack_1070 = iVar63;
      iStack_1068 = iVar66;
    }
    local_2ec4 = local_2ec4 + 7;
  }
  local_3304 = 6;
  while( true ) {
    if (0x30 < local_3304) break;
    local_1908 = local_3304 / 7;
    local_3310 = local_18a8 + (long)local_1908 * 2;
    in_stack_ffffffffffffc5a0 = local_18a8 + (long)local_1908 * 2;
    local_3318 = in_stack_ffffffffffffc5a0 + (long)((local_3304 % 7) * local_18ac) * 2;
    local_331c = local_18c4;
    local_1904 = 1;
    if ((int)H != 0) {
      local_1904 = 4;
    }
    memset(&local_3400,0,0xe0);
    do {
      local_3404 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_331c < 4)) {
        local_1904 = in_stack_00000008 - local_331c;
      }
      local_1158 = (ushort)local_1904;
      local_942 = (ushort)local_1904;
      local_944 = (ushort)local_1904;
      local_946 = (ushort)local_1904;
      local_948 = (ushort)local_1904;
      local_94a = (ushort)local_1904;
      local_94c = (ushort)local_1904;
      local_94e = (ushort)local_1904;
      local_950 = (ushort)local_1904;
      local_952 = (ushort)local_1904;
      local_954 = (ushort)local_1904;
      local_956 = (ushort)local_1904;
      local_958 = (ushort)local_1904;
      local_95a = (ushort)local_1904;
      local_95c = (ushort)local_1904;
      local_95e = (ushort)local_1904;
      local_960 = (ushort)local_1904;
      auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
      auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
      auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
      auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
      auVar53._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
      auVar53._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_
      ;
      local_980._16_8_ = auVar53._16_8_;
      uVar49 = local_980._16_8_;
      local_980._24_8_ = auVar53._24_8_;
      uVar56 = local_980._24_8_;
      in_stack_ffffffffffffc59e = (ushort)local_1904;
      local_980 = auVar53;
      for (; local_3404 < (int)local_18d0; local_3404 = local_3404 + 0x10) {
        local_16a0 = (undefined1 (*) [32])(local_3318 + (long)local_3404 * 2);
        local_760 = *(undefined8 *)*local_16a0;
        uStack_758 = *(undefined8 *)(*local_16a0 + 8);
        uStack_750 = *(undefined8 *)(*local_16a0 + 0x10);
        uStack_748 = *(undefined8 *)(*local_16a0 + 0x18);
        auVar21._16_8_ = uVar49;
        auVar21._0_16_ = auVar53._0_16_;
        auVar21._24_8_ = uVar56;
        vpmullw_avx2(*local_16a0,auVar21);
        local_780 = auVar53._0_16_;
        auStack_770 = auVar53._16_16_;
        for (local_3484 = 0; local_3484 < 1; local_3484 = local_3484 + 1) {
          local_16a8 = local_3310 + (long)local_3404 * 2 + (long)(local_18ac * 6) * 2 +
                       (long)(local_3484 * local_18ac) * 2;
          src_25[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_25[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_25[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_25[1] = in_stack_ffffffffffffc5c0;
          src_25[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_25[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_25[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_25[3] = in_stack_ffffffffffffc5d0;
          dgd_52[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_52[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_52[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_52[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_52[1] = in_stack_ffffffffffffc5a0;
          dgd_52[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_52[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_52[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_52[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_25,dgd_52,in_stack_ffffffffffffc590);
        }
      }
      if (local_18d4 != 0) {
        local_16b0 = (undefined1 (*) [32])(local_3318 + (long)local_3404 * 2);
        local_1480 = *(undefined8 *)*local_16b0;
        uStack_1478 = *(undefined8 *)(*local_16b0 + 8);
        uStack_1470 = *(undefined8 *)(*local_16b0 + 0x10);
        uStack_1468 = *(undefined8 *)(*local_16b0 + 0x18);
        local_14a0 = local_1900;
        uStack_1498 = uStack_18f8;
        uStack_1490 = uStack_18f0;
        uStack_1488 = uStack_18e8;
        auVar4._8_8_ = uStack_18f8;
        auVar4._0_8_ = local_1900;
        auVar4._16_8_ = uStack_18f0;
        auVar4._24_8_ = uStack_18e8;
        auVar55 = vpand_avx2(*local_16b0,auVar4);
        local_3500 = auVar55._0_8_;
        uStack_34f8 = auVar55._8_8_;
        uStack_34f0 = auVar55._16_8_;
        uStack_34e8 = auVar55._24_8_;
        local_7a0 = local_3500;
        uStack_798 = uStack_34f8;
        uStack_790 = uStack_34f0;
        uStack_788 = uStack_34e8;
        auVar20._16_8_ = uVar49;
        auVar20._0_16_ = auVar53._0_16_;
        auVar20._24_8_ = uVar56;
        vpmullw_avx2(auVar55,auVar20);
        for (local_3524 = 0; local_7c0 = auVar53._0_16_, auStack_7b0 = auVar53._16_16_,
            local_3524 < 1; local_3524 = local_3524 + 1) {
          local_16b8 = local_3310 + (long)local_3404 * 2 + (long)(local_18ac * 6) * 2 +
                       (long)(local_3524 * local_18ac) * 2;
          src_26[0]._4_2_ = in_stack_ffffffffffffc5bc;
          src_26[0]._0_4_ = in_stack_ffffffffffffc5b8;
          src_26[0]._6_2_ = in_stack_ffffffffffffc5be;
          src_26[1] = in_stack_ffffffffffffc5c0;
          src_26[2]._0_4_ = in_stack_ffffffffffffc5c8;
          src_26[2]._4_2_ = in_stack_ffffffffffffc5cc;
          src_26[2]._6_2_ = in_stack_ffffffffffffc5ce;
          src_26[3] = in_stack_ffffffffffffc5d0;
          dgd_53[0]._2_2_ = in_stack_ffffffffffffc59a;
          dgd_53[0]._0_2_ = in_stack_ffffffffffffc598;
          dgd_53[0]._4_2_ = in_stack_ffffffffffffc59c;
          dgd_53[0]._6_2_ = in_stack_ffffffffffffc59e;
          dgd_53[1] = in_stack_ffffffffffffc5a0;
          dgd_53[2]._0_4_ = in_stack_ffffffffffffc5a8;
          dgd_53[2]._4_2_ = in_stack_ffffffffffffc5ac;
          dgd_53[2]._6_2_ = in_stack_ffffffffffffc5ae;
          dgd_53[3] = in_stack_ffffffffffffc5b0;
          madd_and_accum_avx2(src_26,dgd_53,in_stack_ffffffffffffc590);
          auVar53._0_16_ = local_7c0;
          auVar53._16_16_ = auStack_7b0;
        }
      }
      local_331c = local_1904 + local_331c;
      local_3310 = local_3310 + (long)(int)(local_1904 * local_18ac) * 2;
      local_3318 = local_3318 + (long)(int)(local_1904 * local_18ac) * 2;
    } while (local_331c < in_stack_00000008);
    puVar48 = &local_33a0;
    src0_20[1] = local_37c0;
    src0_20[0] = uVar70;
    src0_20[2] = iStack_37b8;
    src0_20[3] = lStack_37b0;
    src1_20[0]._6_2_ = uVar68;
    src1_20[0]._0_6_ = in_stack_ffffffffffffc5f8;
    src1_20[1] = auVar69._0_8_;
    src1_20[2] = auVar69._8_8_;
    src1_20[3] = auVar69._16_8_;
    iVar51 = local_3400;
    iVar58 = iStack_33f8;
    iVar62 = iStack_33f0;
    iVar65 = iStack_33e8;
    hadd_four_32_to_64_avx2
              (src0_20,src1_20,in_stack_ffffffffffffc5f0,
               (__m256i *)
               CONCAT26(in_stack_ffffffffffffc5ee,
                        CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
    v[1] = extraout_RDX;
    v[0] = (longlong)puVar48;
    local_1760 = iVar51;
    iStack_1758 = iVar58;
    iStack_1750 = iVar62;
    iStack_1748 = iVar65;
    xx_storel_64(M + local_3304 * 0x32,v);
    while (local_1908 = local_1908 + 1, local_1908 < 7) {
      local_3310 = local_18a8;
      local_3318 = local_18a8 + (long)(local_3304 / 7) * 2 +
                   (long)((local_3304 % 7) * local_18ac) * 2;
      local_1880 = 0;
      uStack_1878 = 0;
      uStack_1870 = 0;
      uStack_1868 = 0;
      local_3400 = 0;
      iStack_33f8 = 0;
      iStack_33f0 = 0;
      iStack_33e8 = 0;
      local_33e0 = 0;
      uStack_33d8 = 0;
      uStack_33d0 = 0;
      uStack_33c8 = 0;
      local_33c0 = 0;
      uStack_33b8 = 0;
      uStack_33b0 = 0;
      uStack_33a8 = 0;
      local_33a0 = 0;
      uStack_3398 = 0;
      uStack_3390 = 0;
      uStack_3388 = 0;
      local_3380 = 0;
      iStack_3378 = 0;
      iStack_3370 = 0;
      iStack_3368 = 0;
      local_3360 = 0;
      uStack_3358 = 0;
      uStack_3350 = 0;
      uStack_3348 = 0;
      local_3340 = 0;
      uStack_3338 = 0;
      uStack_3330 = 0;
      uStack_3328 = 0;
      local_331c = local_18c4;
      local_1904 = 1;
      if ((int)H != 0) {
        local_1904 = 4;
      }
      do {
        local_35a4 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_331c < 4)) {
          local_1904 = in_stack_00000008 - local_331c;
        }
        local_115a = (ushort)local_1904;
        local_902 = (ushort)local_1904;
        local_904 = (ushort)local_1904;
        local_906 = (ushort)local_1904;
        local_908 = (ushort)local_1904;
        local_90a = (ushort)local_1904;
        local_90c = (ushort)local_1904;
        local_90e = (ushort)local_1904;
        local_910 = (ushort)local_1904;
        local_912 = (ushort)local_1904;
        local_914 = (ushort)local_1904;
        local_916 = (ushort)local_1904;
        local_918 = (ushort)local_1904;
        local_91a = (ushort)local_1904;
        local_91c = (ushort)local_1904;
        local_91e = (ushort)local_1904;
        local_920 = (ushort)local_1904;
        auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
        auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
        auVar54._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
        auVar54._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
        local_940._16_8_ = auVar54._16_8_;
        uVar49 = local_940._16_8_;
        local_940._24_8_ = auVar54._24_8_;
        uVar56 = local_940._24_8_;
        in_stack_ffffffffffffc59c = (ushort)local_1904;
        local_940 = auVar54;
        for (; local_35a4 < (int)local_18d0; local_35a4 = local_35a4 + 0x10) {
          local_16c0 = (undefined1 (*) [32])(local_3318 + (long)local_35a4 * 2);
          local_7e0 = *(undefined8 *)*local_16c0;
          uStack_7d8 = *(undefined8 *)(*local_16c0 + 8);
          uStack_7d0 = *(undefined8 *)(*local_16c0 + 0x10);
          uStack_7c8 = *(undefined8 *)(*local_16c0 + 0x18);
          auVar19._16_8_ = uVar49;
          auVar19._0_16_ = auVar54._0_16_;
          auVar19._24_8_ = uVar56;
          vpmullw_avx2(*local_16c0,auVar19);
          local_800 = auVar54._0_16_;
          auStack_7f0 = auVar54._16_16_;
          for (local_3624 = 0; local_3624 < 7; local_3624 = local_3624 + 1) {
            local_16c8 = local_3310 + (long)local_1908 * 2 + (long)local_35a4 * 2 +
                         (long)(local_3624 * local_18ac) * 2;
            src_27[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_27[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_27[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_27[1] = in_stack_ffffffffffffc5c0;
            src_27[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_27[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_27[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_27[3] = in_stack_ffffffffffffc5d0;
            dgd_54[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_54[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_54[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_54[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_54[1] = in_stack_ffffffffffffc5a0;
            dgd_54[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_54[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_54[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_54[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_27,dgd_54,in_stack_ffffffffffffc590);
          }
        }
        if (local_18d4 != 0) {
          local_16d0 = (undefined1 (*) [32])(local_3318 + (long)local_35a4 * 2);
          local_14c0 = *(undefined8 *)*local_16d0;
          uStack_14b8 = *(undefined8 *)(*local_16d0 + 8);
          uStack_14b0 = *(undefined8 *)(*local_16d0 + 0x10);
          uStack_14a8 = *(undefined8 *)(*local_16d0 + 0x18);
          local_14e0 = local_1900;
          uStack_14d8 = uStack_18f8;
          uStack_14d0 = uStack_18f0;
          uStack_14c8 = uStack_18e8;
          auVar3._8_8_ = uStack_18f8;
          auVar3._0_8_ = local_1900;
          auVar3._16_8_ = uStack_18f0;
          auVar3._24_8_ = uStack_18e8;
          auVar55 = vpand_avx2(*local_16d0,auVar3);
          local_36a0 = auVar55._0_8_;
          uStack_3698 = auVar55._8_8_;
          uStack_3690 = auVar55._16_8_;
          uStack_3688 = auVar55._24_8_;
          local_820 = local_36a0;
          uStack_818 = uStack_3698;
          uStack_810 = uStack_3690;
          uStack_808 = uStack_3688;
          auVar18._16_8_ = uVar49;
          auVar18._0_16_ = auVar54._0_16_;
          auVar18._24_8_ = uVar56;
          vpmullw_avx2(auVar55,auVar18);
          for (local_36c4 = 0; local_840 = auVar54._0_16_, auStack_830 = auVar54._16_16_,
              local_36c4 < 7; local_36c4 = local_36c4 + 1) {
            local_16d8 = local_3310 + (long)local_1908 * 2 + (long)local_35a4 * 2 +
                         (long)(local_36c4 * local_18ac) * 2;
            src_28[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_28[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_28[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_28[1] = in_stack_ffffffffffffc5c0;
            src_28[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_28[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_28[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_28[3] = in_stack_ffffffffffffc5d0;
            dgd_55[0]._2_2_ = in_stack_ffffffffffffc59a;
            dgd_55[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_55[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_55[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_55[1] = in_stack_ffffffffffffc5a0;
            dgd_55[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_55[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_55[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_55[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_28,dgd_55,in_stack_ffffffffffffc590);
            auVar54._0_16_ = local_840;
            auVar54._16_16_ = auStack_830;
          }
        }
        local_331c = local_1904 + local_331c;
        local_3310 = local_3310 + (long)(int)(local_1904 * local_18ac) * 2;
        local_3318 = local_3318 + (long)(int)(local_1904 * local_18ac) * 2;
      } while (local_331c < in_stack_00000008);
      src0_21[1] = local_37c0;
      src0_21[0] = uVar70;
      src0_21[2] = iStack_37b8;
      src0_21[3] = lStack_37b0;
      src1_21[0]._6_2_ = uVar68;
      src1_21[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_21[1] = auVar69._0_8_;
      src1_21[2] = auVar69._8_8_;
      src1_21[3] = auVar69._16_8_;
      iVar51 = local_3400;
      iVar58 = iStack_33f8;
      iVar62 = iStack_33f0;
      iVar65 = iStack_33e8;
      hadd_four_32_to_64_avx2
                (src0_21,src1_21,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      local_1088 = M + (long)(local_3304 * 0x31) + (long)(local_1908 * 7);
      *local_1088 = iVar51;
      local_1088[1] = iVar58;
      local_1088[2] = iVar62;
      local_1088[3] = iVar65;
      src0_22[1] = local_37c0;
      src0_22[0] = uVar70;
      src0_22[2] = iStack_37b8;
      src0_22[3] = lStack_37b0;
      src1_22[0]._6_2_ = uVar68;
      src1_22[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_22[1] = auVar69._0_8_;
      src1_22[2] = auVar69._8_8_;
      src1_22[3] = auVar69._16_8_;
      iVar52 = local_3380;
      iVar59 = iStack_3378;
      iVar63 = iStack_3370;
      iVar66 = iStack_3368;
      local_10c0 = iVar51;
      iStack_10b8 = iVar58;
      iStack_10b0 = iVar62;
      iStack_10a8 = iVar65;
      hadd_four_32_to_64_avx2
                (src0_22,src1_22,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      lVar46 = (long)(local_3304 * 0x31);
      lVar47 = (long)(local_1908 * 7);
      local_10c8 = M + lVar46 + lVar47 + 4;
      *local_10c8 = iVar52;
      M[lVar46 + lVar47 + 5] = iVar59;
      M[lVar46 + lVar47 + 6] = iVar63;
      M[lVar46 + lVar47 + 7] = iVar66;
      local_1100 = iVar52;
      iStack_10f8 = iVar59;
      iStack_10f0 = iVar63;
      iStack_10e8 = iVar66;
    }
    local_3304 = local_3304 + 7;
  }
  for (local_3744 = 7; local_3744 < 0x31; local_3744 = local_3744 + 7) {
    local_1908 = local_3744 / 7;
    local_3748 = 0;
    iVar51 = local_37c0;
    do {
      local_374c = local_18c4;
      local_3758 = local_18a8 + (long)(local_3744 / 7) * 2;
      local_3760 = local_18a8 + (long)(local_3744 / 7) * 2 +
                   (long)((local_3744 % 7) * local_18ac) * 2;
      local_1904 = (uint)((int)H != 0) * 3 + 1;
      local_37c0 = 0;
      local_18a0 = ZEXT432(0) << 0x40;
      iVar58 = 0;
      iVar62 = 0;
      iVar65 = iStack_37b8;
      lVar71 = lStack_37b0;
      do {
        local_3844 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_374c < 4)) {
          local_1904 = in_stack_00000008 - local_374c;
        }
        local_115c = (ushort)local_1904;
        local_8c2 = (ushort)local_1904;
        local_8c4 = (ushort)local_1904;
        local_8c6 = (ushort)local_1904;
        local_8c8 = (ushort)local_1904;
        local_8ca = (ushort)local_1904;
        local_8cc = (ushort)local_1904;
        local_8ce = (ushort)local_1904;
        local_8d0 = (ushort)local_1904;
        local_8d2 = (ushort)local_1904;
        local_8d4 = (ushort)local_1904;
        local_8d6 = (ushort)local_1904;
        local_8d8 = (ushort)local_1904;
        local_8da = (ushort)local_1904;
        local_8dc = (ushort)local_1904;
        local_8de = (ushort)local_1904;
        local_8e0 = (ushort)local_1904;
        auVar55._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,2);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,3);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,4);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,5);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,6);
        auVar55._16_16_ = vpinsrw_avx(auVar55._16_16_,local_1904 & 0xffff,7);
        auVar55._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1904),local_1904 & 0xffff,1);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,2);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,3);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,4);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,5);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,6);
        auVar55._0_16_ = vpinsrw_avx(auVar55._0_16_,local_1904 & 0xffff,7);
        auVar55._0_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar55._0_16_;
        auVar55._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55._16_16_;
        local_900._16_8_ = auVar55._16_8_;
        uVar49 = local_900._16_8_;
        local_900._24_8_ = auVar55._24_8_;
        uVar56 = local_900._24_8_;
        uVar67 = (ushort)local_1904;
        local_900 = auVar55;
        for (; local_3844 < (int)local_18d0; local_3844 = local_3844 + 0x10) {
          local_16e0 = (undefined1 (*) [32])(local_3760 + (long)local_3844 * 2);
          local_860 = *(undefined8 *)*local_16e0;
          uStack_858 = *(undefined8 *)(*local_16e0 + 8);
          uStack_850 = *(undefined8 *)(*local_16e0 + 0x10);
          uStack_848 = *(undefined8 *)(*local_16e0 + 0x18);
          auVar17._16_8_ = uVar49;
          auVar17._0_16_ = auVar55._0_16_;
          auVar17._24_8_ = uVar56;
          vpmullw_avx2(*local_16e0,auVar17);
          local_880 = auVar55._0_16_;
          auStack_870 = auVar55._16_16_;
          for (local_38c4 = 0; local_38c4 < 7; local_38c4 = local_38c4 + 1) {
            local_16e8 = local_3758 + (long)local_3748 * 2 + (long)local_3844 * 2 +
                         (long)(local_38c4 * local_18ac) * 2;
            src_29[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_29[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_29[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_29[1] = in_stack_ffffffffffffc5c0;
            src_29[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_29[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_29[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_29[3] = in_stack_ffffffffffffc5d0;
            dgd_56[0]._2_2_ = uVar67;
            dgd_56[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_56[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_56[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_56[1] = in_stack_ffffffffffffc5a0;
            dgd_56[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_56[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_56[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_56[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_29,dgd_56,in_stack_ffffffffffffc590);
          }
        }
        if (local_18d4 != 0) {
          local_16f0 = (undefined1 (*) [32])(local_3760 + (long)local_3844 * 2);
          local_1500 = *(undefined8 *)*local_16f0;
          uStack_14f8 = *(undefined8 *)(*local_16f0 + 8);
          uStack_14f0 = *(undefined8 *)(*local_16f0 + 0x10);
          uStack_14e8 = *(undefined8 *)(*local_16f0 + 0x18);
          local_1520 = local_1900;
          uStack_1518 = uStack_18f8;
          uStack_1510 = uStack_18f0;
          uStack_1508 = uStack_18e8;
          auVar2._8_8_ = uStack_18f8;
          auVar2._0_8_ = local_1900;
          auVar2._16_8_ = uStack_18f0;
          auVar2._24_8_ = uStack_18e8;
          auVar1 = vpand_avx2(*local_16f0,auVar2);
          local_3940 = auVar1._0_8_;
          uStack_3938 = auVar1._8_8_;
          uStack_3930 = auVar1._16_8_;
          uStack_3928 = auVar1._24_8_;
          local_8a0 = local_3940;
          uStack_898 = uStack_3938;
          uStack_890 = uStack_3930;
          uStack_888 = uStack_3928;
          auVar16._16_8_ = uVar49;
          auVar16._0_16_ = auVar55._0_16_;
          auVar16._24_8_ = uVar56;
          in_stack_ffffffffffffc6a0 = vpmullw_avx2(auVar1,auVar16);
          for (local_3964 = 0; local_8c0 = auVar55._0_16_, auStack_8b0 = auVar55._16_16_,
              local_3964 < 7; local_3964 = local_3964 + 1) {
            local_16f8 = local_3758 + (long)local_3748 * 2 + (long)local_3844 * 2 +
                         (long)(local_3964 * local_18ac) * 2;
            src_30[0]._4_2_ = in_stack_ffffffffffffc5bc;
            src_30[0]._0_4_ = in_stack_ffffffffffffc5b8;
            src_30[0]._6_2_ = in_stack_ffffffffffffc5be;
            src_30[1] = in_stack_ffffffffffffc5c0;
            src_30[2]._0_4_ = in_stack_ffffffffffffc5c8;
            src_30[2]._4_2_ = in_stack_ffffffffffffc5cc;
            src_30[2]._6_2_ = in_stack_ffffffffffffc5ce;
            src_30[3] = in_stack_ffffffffffffc5d0;
            dgd_57[0]._2_2_ = uVar67;
            dgd_57[0]._0_2_ = in_stack_ffffffffffffc598;
            dgd_57[0]._4_2_ = in_stack_ffffffffffffc59c;
            dgd_57[0]._6_2_ = in_stack_ffffffffffffc59e;
            dgd_57[1] = in_stack_ffffffffffffc5a0;
            dgd_57[2]._0_4_ = in_stack_ffffffffffffc5a8;
            dgd_57[2]._4_2_ = in_stack_ffffffffffffc5ac;
            dgd_57[2]._6_2_ = in_stack_ffffffffffffc5ae;
            dgd_57[3] = in_stack_ffffffffffffc5b0;
            madd_and_accum_avx2(src_30,dgd_57,in_stack_ffffffffffffc590);
            auVar55._0_16_ = local_8c0;
            auVar55._16_16_ = auStack_8b0;
          }
        }
        local_374c = local_1904 + local_374c;
        local_3758 = local_3758 + (long)(int)(local_1904 * local_18ac) * 2;
        local_3760 = local_3760 + (long)(int)(local_1904 * local_18ac) * 2;
      } while (local_374c < in_stack_00000008);
      iStack_3830 = 0;
      iStack_3828 = 0;
      src0_23[1] = iVar51;
      src0_23[0] = uVar70;
      src0_23[2] = iVar65;
      src0_23[3] = lVar71;
      src1_23[0]._6_2_ = uVar68;
      src1_23[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_23[1] = auVar69._0_8_;
      src1_23[2] = auVar69._8_8_;
      src1_23[3] = auVar69._16_8_;
      hadd_four_32_to_64_avx2
                (src0_23,src1_23,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      iStack_37b8 = 0;
      lStack_37b0 = 0;
      puStack_37a8 = (undefined8 *)0x0;
      src0_24[1] = iVar51;
      src0_24[0] = uVar70;
      src0_24[2] = iVar65;
      src0_24[3] = lVar71;
      src1_24[0]._6_2_ = uVar68;
      src1_24[0]._0_6_ = in_stack_ffffffffffffc5f8;
      src1_24[1] = auVar69._0_8_;
      src1_24[2] = auVar69._8_8_;
      src1_24[3] = auVar69._16_8_;
      hadd_four_32_to_64_avx2
                (src0_24,src1_24,in_stack_ffffffffffffc5f0,
                 (__m256i *)
                 CONCAT26(in_stack_ffffffffffffc5ee,
                          CONCAT24(in_stack_ffffffffffffc5ec,in_stack_ffffffffffffc5e8)));
      local_1108 = M + (long)(local_3744 * 0x31) + (long)(local_1908 * 7);
      *local_1108 = iVar58;
      local_1108[1] = iVar62;
      local_1108[2] = iStack_3830;
      local_1108[3] = iStack_3828;
      local_118 = M + (long)(local_3744 * 0x31) + (long)(local_1908 * 7) + 4;
      *local_118 = local_37c0;
      local_118[1] = iStack_37b8;
      *puStack_37a8 = local_b0;
      local_3748 = local_3748 + 1;
      local_1908 = local_1908 + 1;
      iVar51 = local_37c0;
      local_1780 = local_37c0;
      iStack_1778 = iStack_37b8;
      lStack_1770 = lStack_37b0;
      puStack_1768 = puStack_37a8;
      local_1140 = iVar58;
      iStack_1138 = iVar62;
      iStack_1130 = iStack_3830;
      iStack_1128 = iStack_3828;
      local_130 = local_37c0;
      iStack_128 = iStack_37b8;
      lStack_a0 = lStack_37b0;
      local_98 = puStack_37a8;
    } while (local_1908 < 7);
  }
  fill_lower_triag_elements_avx2(in_stack_ffffffffffffc6a0._20_4_,in_stack_ffffffffffffc6a0._8_8_);
  return;
}

Assistant:

static void compute_stats_win7_avx2(const int16_t *const d, int32_t d_stride,
                                    const int16_t *const s, int32_t s_stride,
                                    int32_t width, int v_start, int v_end,
                                    int64_t *const M, int64_t *const H,
                                    int use_downsampled_wiener_stats) {
  const int32_t wiener_win = WIENER_WIN;
  const int32_t wiener_win2 = wiener_win * wiener_win;
  // Amount of width which is beyond multiple of 16. This case is handled
  // appropriately to process only the required width towards the end.
  const int32_t wd_mul16 = width & ~15;
  const int32_t wd_beyond_mul16 = width - wd_mul16;
  const __m256i mask =
      _mm256_loadu_si256((__m256i *)(&mask_16bit[16 - wd_beyond_mul16]));
  int downsample_factor;

  // Step 1: Full M (i.e., M0 to M48) and first row H (i.e., H00 to H048)
  // values are filled here. Here, the loop over 'j' is executed for values 0
  // to 6. When the loop executed for a specific 'j', 7 values of M and H are
  // filled as shown below.
  // j=0: M0-M6 and H00-H06, j=1: M7-M13 and H07-H013 are filled etc,.
  int j = 0;
  do {
    const int16_t *s_t = s;
    const int16_t *d_t = d;
    __m256i sum_m[WIENER_WIN] = { _mm256_setzero_si256() };
    __m256i sum_h[WIENER_WIN] = { _mm256_setzero_si256() };
    downsample_factor =
        use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;
    int proc_ht = v_start;
    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i src = _mm256_loadu_si256((__m256i *)(s_t + proc_wd));
        const __m256i dgd = _mm256_loadu_si256((__m256i *)(d_t + proc_wd));
        const __m256i src_mul_df = _mm256_mullo_epi16(src, df_reg);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_MH_VALUES(d_t + j + proc_wd)

        proc_wd += 16;
      }

      if (wd_beyond_mul16) {
        const __m256i src = _mm256_loadu_si256((__m256i *)(s_t + proc_wd));
        const __m256i dgd = _mm256_loadu_si256((__m256i *)(d_t + proc_wd));
        const __m256i src_mask = _mm256_and_si256(src, mask);
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i src_mul_df = _mm256_mullo_epi16(src_mask, df_reg);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_MH_VALUES(d_t + j + proc_wd)
      }
      proc_ht += downsample_factor;
      s_t += downsample_factor * s_stride;
      d_t += downsample_factor * d_stride;
    } while (proc_ht < v_end);

    const __m256i s_m0 =
        hadd_four_32_to_64_avx2(sum_m[0], sum_m[1], &sum_m[2], &sum_m[3]);
    const __m256i s_m1 =
        hadd_four_32_to_64_avx2(sum_m[4], sum_m[5], &sum_m[6], &sum_m[6]);
    _mm256_storeu_si256((__m256i *)(M + wiener_win * j + 0), s_m0);
    _mm_storeu_si128((__m128i *)(M + wiener_win * j + 4),
                     _mm256_castsi256_si128(s_m1));
    _mm_storel_epi64((__m128i *)&M[wiener_win * j + 6],
                     _mm256_extracti128_si256(s_m1, 1));

    const __m256i sh_0 =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    const __m256i sh_1 =
        hadd_four_32_to_64_avx2(sum_h[4], sum_h[5], &sum_h[6], &sum_h[6]);
    _mm256_storeu_si256((__m256i *)(H + wiener_win * j + 0), sh_0);
    _mm_storeu_si128((__m128i *)(H + wiener_win * j + 4),
                     _mm256_castsi256_si128(sh_1));
    _mm_storel_epi64((__m128i *)&H[wiener_win * j + 6],
                     _mm256_extracti128_si256(sh_1, 1));
  } while (++j < wiener_win);

  // The below steps are designed to fill remaining rows of H buffer. Here, aim
  // is to fill only upper triangle elements correspond to each row and lower
  // triangle elements are copied from upper-triangle elements. Also, as
  // mentioned in Step 1, the core function is designed to fill 7
  // elements/stats/values of H buffer.
  //
  // Step 2: Here, the rows 1, 8, 15, 22, 29, 36 and 43 are filled. As we need
  // to fill only upper-triangle elements, H10 from row1, H80-H86 and H87 from
  // row8, etc. are need not be filled. As the core function process 7 values,
  // in first iteration of 'j' only 6 values to be filled i.e., H11-H16 from
  // row1 and H88-H813 from row8, etc.
  for (int i = 1; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN)

    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (1 * d_stride), 6)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (1 * d_stride), 6)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + i), s_h);
    const __m128i s_h0 = convert_32_to_64_add_avx2(sum_h[4], sum_h[5]);
    _mm_storeu_si128((__m128i *)(H + (i * wiener_win2) + i + 4), s_h0);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN7
  }

  // Step 3: Here, the rows 2, 9, 16, 23, 30, 37 and 44 are filled. As we need
  // to fill only upper-triangle elements, H20-H21 from row2, H90-H96 and
  // H97-H98 from row9, etc. are need not be filled. As the core function
  // process 7 values, in first iteration of 'j' only 5 values to be filled
  // i.e., H22-H26 from row2 and H99-H913 from row9, etc.
  for (int i = 2; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN)
    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (2 * d_stride), 5)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (2 * d_stride), 5)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + i), s_h);
    const __m256i s_m_h = convert_and_add_avx2(sum_h[4]);
    const __m128i s_m_h0 = add_64bit_lvl_avx2(s_m_h, s_m_h);
    _mm_storel_epi64((__m128i *)(H + (i * wiener_win2) + i + 4), s_m_h0);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN7
  }

  // Step 4: Here, the rows 3, 10, 17, 24, 31, 38 and 45 are filled. As we need
  // to fill only upper-triangle elements, H30-H32 from row3, H100-H106 and
  // H107-H109 from row10, etc. are need not be filled. As the core function
  // process 7 values, in first iteration of 'j' only 4 values to be filled
  // i.e., H33-H36 from row3 and H1010-H1013 from row10, etc.
  for (int i = 3; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN)

    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (3 * d_stride), 4)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (3 * d_stride), 4)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + i), s_h);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN7
  }

  // Step 5: Here, the rows 4, 11, 18, 25, 32, 39 and 46 are filled. As we need
  // to fill only upper-triangle elements, H40-H43 from row4, H110-H116 and
  // H117-H1110 from row10, etc. are need not be filled. As the core function
  // process 7 values, in first iteration of 'j' only 3 values to be filled
  // i.e., H44-H46 from row4 and H1111-H1113 from row11, etc.
  for (int i = 4; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN)

    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (4 * d_stride), 3)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (4 * d_stride), 3)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + i), s_h);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN7
  }

  // Step 6: Here, the rows 5, 12, 19, 26, 33, 40 and 47 are filled. As we need
  // to fill only upper-triangle elements, H50-H54 from row5, H120-H126 and
  // H127-H1211 from row12, etc. are need not be filled. As the core function
  // process 7 values, in first iteration of 'j' only 2 values to be filled
  // i.e., H55-H56 from row5 and H1212-H1213 from row12, etc.
  for (int i = 5; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN)
    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (5 * d_stride), 2)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (5 * d_stride), 2)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + i), s_h);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN7
  }

  // Step 7: Here, the rows 6, 13, 20, 27, 34, 41 and 48 are filled. As we need
  // to fill only upper-triangle elements, H60-H65 from row6, H130-H136 and
  // H137-H1312 from row13, etc. are need not be filled. As the core function
  // process 7 values, in first iteration of 'j' only 1 value to be filled
  // i.e., H66 from row6 and H1313 from row13, etc.
  for (int i = 6; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN)
    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (6 * d_stride), 1)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (6 * d_stride), 1)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    xx_storel_64(&H[(i * wiener_win2) + i], _mm256_castsi256_si128(s_h));

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN7
  }

  // Step 8: Here, the rows 7, 14, 21, 28, 35 and 42 are filled. As we need
  // to fill only upper-triangle elements, H70-H75 from row7, H140-H146 and
  // H147-H1413 from row14, etc. are need not be filled. The first iteration of
  // 'j' fills H77-H713 from row7 and H1414-H1420 from row14, etc.
  for (int i = 7; i < wiener_win2; i += wiener_win) {
    // Derive j'th iteration from where the H buffer filling needs to be
    // started.
    j = i / wiener_win;
    int shift = 0;
    do {
      // Update the dgd pointers appropriately.
      int proc_ht = v_start;
      const int16_t *d_window = d + (i / WIENER_WIN);
      const int16_t *d_current_row =
          d + (i / WIENER_WIN) + ((i % WIENER_WIN) * d_stride);
      downsample_factor =
          use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;
      __m256i sum_h[WIENER_WIN] = { _mm256_setzero_si256() };
      do {
        UPDATE_DOWNSAMPLE_FACTOR

        // Process the amount of width multiple of 16.
        while (proc_wd < wd_mul16) {
          const __m256i dgd =
              _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
          const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
          INIT_H_VALUES(d_window + shift + proc_wd, 7)

          proc_wd += 16;
        }

        // Process the remaining width here.
        if (wd_beyond_mul16) {
          const __m256i dgd =
              _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
          const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
          const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
          INIT_H_VALUES(d_window + shift + proc_wd, 7)
        }
        proc_ht += downsample_factor;
        d_window += downsample_factor * d_stride;
        d_current_row += downsample_factor * d_stride;
      } while (proc_ht < v_end);

      const __m256i sh_0 =
          hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
      const __m256i sh_1 =
          hadd_four_32_to_64_avx2(sum_h[4], sum_h[5], &sum_h[6], &sum_h[6]);
      _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + (wiener_win * j)),
                          sh_0);
      _mm_storeu_si128(
          (__m128i *)(H + (i * wiener_win2) + (wiener_win * j) + 4),
          _mm256_castsi256_si128(sh_1));
      _mm_storel_epi64((__m128i *)&H[(i * wiener_win2) + (wiener_win * j) + 6],
                       _mm256_extracti128_si256(sh_1, 1));
      shift++;
    } while (++j < wiener_win);
  }

  fill_lower_triag_elements_avx2(wiener_win2, H);
}